

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressBlock_btultra2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *iend;
  ZSTD_optimal_t *pZVar1;
  ZSTD_optimal_t *pZVar2;
  undefined8 *puVar3;
  seqDef *psVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  undefined8 uVar8;
  int iVar9;
  U32 (*paUVar10) [3];
  optState_t *optPtr;
  U32 i;
  U32 UVar11;
  int iVar12;
  U32 UVar13;
  U32 UVar14;
  ulong uVar15;
  long lVar16;
  BYTE *pBVar17;
  uint uVar18;
  uint *puVar19;
  uint *puVar20;
  ulong uVar21;
  ulong uVar22;
  ulong *puVar23;
  uint uVar24;
  uint uVar25;
  BYTE *base;
  BYTE *pBVar26;
  uint uVar27;
  BYTE *base_1;
  BYTE *pBVar28;
  uint uVar29;
  uint uVar30;
  ulong *puVar31;
  ulong *puVar32;
  ulong uVar33;
  U32 *pUVar34;
  uint uVar35;
  ulong *puVar36;
  uint uVar37;
  U32 UVar38;
  uint uVar39;
  ulong uVar40;
  BYTE *pBVar41;
  ulong *puVar42;
  ZSTD_optimal_t *pZVar43;
  ulong uVar44;
  ulong *puVar45;
  ulong *puVar46;
  uint uVar47;
  ZSTD_optimal_t *pZVar48;
  ZSTD_optimal_t *pZVar49;
  bool bVar50;
  bool bVar51;
  repcodes_t rVar52;
  U32 dummy32;
  BYTE *pInLoopLimit;
  U32 nextToUpdate3;
  ulong *local_1e0;
  BYTE *local_1d8;
  ulong *local_1c0;
  uint *local_1b8;
  BYTE *local_1a0;
  uint *local_188;
  uint local_16c;
  undefined8 local_168;
  ulong *local_160;
  uint *local_158;
  uint *local_150;
  ZSTD_match_t *local_148;
  uint local_13c;
  U32 *local_138;
  ZSTD_optimal_t *local_130;
  BYTE *local_128;
  uint local_11c;
  ulong *local_118;
  ulong *local_110;
  long local_108;
  ulong *local_100;
  U32 *local_f8;
  uint local_ec;
  U32 (*local_e8) [3];
  ulong *local_e0;
  U32 local_d4;
  BYTE *local_d0;
  U32 *local_c8;
  ulong local_c0;
  ulong *local_b8;
  uint local_ac;
  ZSTD_optimal_t *local_a8;
  optState_t *local_a0;
  ZSTD_optimal_t *local_98;
  ZSTD_optimal_t *local_90;
  ZSTD_optimal_t *local_88;
  U32 local_7c;
  ulong *local_78;
  int local_70;
  int local_6c;
  seqStore_t *local_68;
  ZSTD_optimal_t *local_60;
  undefined8 local_58;
  U32 local_50;
  ulong local_48;
  ulong *local_40;
  ulong local_38;
  
  local_e8 = (U32 (*) [3])rep;
  if (0x20000 < srcSize) {
    __assert_fail("srcSize <= ZSTD_BLOCKSIZE_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x4a30,
                  "size_t ZSTD_compressBlock_btultra2(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                 );
  }
  local_68 = seqStore;
  if (((((ms->opt).litLengthSum == 0) && (seqStore->sequences == seqStore->sequencesStart)) &&
      (UVar38 = (ms->window).dictLimit, UVar38 == (ms->window).lowLimit)) &&
     ((0x400 < srcSize && (UVar38 == (int)src - *(int *)&(ms->window).base)))) {
    ZSTD_initStats_ultra(ms,seqStore,rep,src,srcSize);
  }
  local_a0 = &ms->opt;
  iend = (ulong *)((long)src + srcSize);
  local_78 = (ulong *)((long)src + (srcSize - 8));
  uVar47 = (ms->window).dictLimit;
  pBVar26 = (ms->window).base;
  local_ac = (ms->cParams).targetLength;
  if (0xffe < local_ac) {
    local_ac = 0xfff;
  }
  uVar25 = (ms->cParams).minMatch;
  local_7c = ms->nextToUpdate;
  local_148 = (ms->opt).matchTable;
  local_98 = (ms->opt).priceTable;
  ZSTD_rescaleFreqs(local_a0,(BYTE *)src,srcSize,2);
  puVar31 = (ulong *)((ulong)(pBVar26 + uVar47 == (BYTE *)src) + (long)src);
  local_e0 = (ulong *)src;
  if (puVar31 < local_78) {
    uVar47 = (uint)(uVar25 != 3);
    local_48 = (ulong)(uVar47 + 3);
    local_d0 = (BYTE *)(ulong)(uVar47 + 2);
    local_160 = (ulong *)((long)iend + -7);
    local_110 = (ulong *)((long)iend + -3);
    local_118 = (ulong *)((long)iend + -1);
    local_40 = iend + -4;
    local_a8 = local_98 + 1;
    local_90 = local_a8;
    local_88 = local_a8;
    local_60 = local_a8;
    local_38 = local_48;
    do {
      iVar12 = (int)puVar31;
      uVar47 = iVar12 - (int)local_e0;
      pBVar26 = (ms->window).base;
      uVar15 = (ulong)ms->nextToUpdate;
      local_1c0._0_4_ = 0;
      if (pBVar26 + uVar15 <= puVar31) {
        UVar38 = (ms->cParams).minMatch;
        while( true ) {
          puVar23 = local_160;
          uVar24 = (uint)uVar15;
          uVar25 = (uint)((long)puVar31 - (long)pBVar26);
          if (uVar25 <= uVar24) break;
          UVar11 = ZSTD_insertBt1(ms,pBVar26 + uVar15,(BYTE *)iend,UVar38,0);
          uVar15 = (ulong)(UVar11 + uVar24);
          if (UVar11 + uVar24 <= uVar24) {
LAB_0012cf42:
            __assert_fail("idx < (U32)(idx + forward)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x4786,
                          "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                         );
          }
        }
        if ((ulong)((long)puVar31 - (long)pBVar26) >> 0x20 != 0) {
LAB_0012d18f:
          __assert_fail("(size_t)(ip - base) <= (size_t)(U32)(-1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x4789,
                        "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                       );
        }
        if ((ulong)((long)iend - (long)pBVar26) >> 0x20 != 0) {
LAB_0012d1ae:
          __assert_fail("(size_t)(iend - base) <= (size_t)(U32)(-1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x478a,
                        "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                       );
        }
        ms->nextToUpdate = uVar25;
        if (UVar38 - 6 < 2) {
          uVar15 = (ulong)(uVar47 == 0);
          uVar25 = (ms->cParams).targetLength;
          if (0xffe < uVar25) {
            uVar25 = 0xfff;
          }
          local_128 = (ms->window).base;
          uVar37 = iVar12 - (int)local_128;
          local_158 = (uint *)(*puVar31 * -0x30e4432340650000 >>
                              (-(char)(ms->cParams).hashLog & 0x3fU));
          local_138 = ms->chainTable;
          uVar35 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
          uVar18 = uVar37 - uVar35;
          uVar24 = 0;
          if (uVar37 < uVar35) {
            uVar18 = 0;
          }
          uVar30 = (ms->window).dictLimit;
          uVar27 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          uVar29 = (ms->window).lowLimit;
          uVar39 = uVar37 - uVar27;
          if (uVar37 - uVar29 <= uVar27) {
            uVar39 = uVar29;
          }
          if (ms->loadedDictEnd != 0) {
            uVar39 = uVar29;
          }
          local_108 = CONCAT44(local_108._4_4_,uVar35);
          uVar33 = (ulong)((uVar35 & uVar37) * 2);
          local_188 = local_138 + uVar33;
          local_1b8 = local_138 + uVar33 + 1;
          local_130 = (ZSTD_optimal_t *)
                      CONCAT44(local_130._4_4_,1 << ((byte)(ms->cParams).searchLog & 0x1f));
          local_168 = (BYTE *)-uVar15;
          bVar50 = true;
          local_f8 = ms->hashTable;
          puVar19 = (uint *)(ulong)local_f8[(long)local_158];
          local_11c = uVar37 + 8;
          uVar35 = uVar37 + 9;
          uVar33 = uVar15 + 3;
          puVar36 = (ulong *)((long)puVar31 + 4);
          local_100 = (ulong *)((long)puVar31 + 0xc);
          local_1a0 = local_d0;
          pBVar26 = (BYTE *)(ulong)uVar30;
          do {
            if (uVar15 == 3) {
              uVar29 = (*local_e8)[0] - 1;
            }
            else {
              uVar29 = (*local_e8)[uVar15];
            }
            local_150 = puVar19;
            if (uVar37 < uVar30) goto LAB_0012cf61;
            if (uVar29 - 1 < uVar37 - uVar30) {
              if ((uint)*puVar31 != *(uint *)((long)puVar31 - (ulong)uVar29)) goto LAB_0012946c;
              puVar42 = (ulong *)((long)puVar36 - (ulong)uVar29);
              puVar32 = puVar36;
              if (puVar36 < local_160) {
                uVar40 = *puVar36 ^ *puVar42;
                uVar22 = 0;
                if (uVar40 != 0) {
                  for (; (uVar40 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                  }
                }
                uVar22 = uVar22 >> 3 & 0x1fffffff;
                iVar12 = (int)uVar22;
                puVar32 = local_100;
                if (*puVar42 == *puVar36) {
                  do {
                    puVar42 = puVar42 + 1;
                    if (local_160 <= puVar32) goto LAB_00129473;
                    uVar40 = *puVar42;
                    uVar44 = *puVar32;
                    uVar21 = 0;
                    if ((uVar44 ^ uVar40) != 0) {
                      for (; ((uVar44 ^ uVar40) >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                      }
                    }
                    puVar46 = (ulong *)((uVar21 >> 3 & 0x1fffffff) + (long)puVar32);
                    puVar32 = puVar32 + 1;
                    if (uVar40 != uVar44) {
                      uVar22 = (long)puVar46 - (long)puVar36;
                      puVar32 = puVar46;
                    }
                    iVar12 = (int)uVar22;
                  } while (uVar40 == uVar44);
                }
              }
              else {
LAB_00129473:
                if ((puVar32 < local_110) && ((uint)*puVar42 == (uint)*puVar32)) {
                  puVar32 = (ulong *)((long)puVar32 + 4);
                  puVar42 = (ulong *)((long)puVar42 + 4);
                }
                if ((puVar32 < local_118) && ((short)*puVar42 == (short)*puVar32)) {
                  puVar32 = (ulong *)((long)puVar32 + 2);
                  puVar42 = (ulong *)((long)puVar42 + 2);
                }
                if (puVar32 < iend) {
                  puVar32 = (ulong *)((long)puVar32 + (ulong)((BYTE)*puVar42 == (BYTE)*puVar32));
                }
                iVar12 = (int)puVar32 - (int)puVar36;
              }
              uVar29 = iVar12 + 4;
            }
            else {
              if (uVar37 < uVar39) goto LAB_0012cf80;
LAB_0012946c:
              uVar29 = 0;
            }
            pBVar17 = (BYTE *)(ulong)uVar29;
            bVar7 = true;
            if (local_1a0 < pBVar17) {
              local_148[uVar24].off = (int)local_168 + (int)uVar15;
              uVar27 = uVar24 + 1;
              local_148[uVar24].len = uVar29;
              bVar51 = (ulong *)((long)puVar31 + (long)pBVar17) != iend;
              bVar7 = bVar51 && uVar29 <= uVar25;
              local_1a0 = pBVar17;
              uVar24 = uVar27;
              if (!bVar51 || uVar29 > uVar25) {
                pBVar26 = (BYTE *)(ulong)uVar27;
              }
            }
            local_1c0._0_4_ = (uint)pBVar26;
            if (!bVar7) break;
            uVar15 = uVar15 + 1;
            bVar50 = uVar15 < uVar33;
          } while (bVar50);
          if (!bVar50) {
            local_f8[(long)local_158] = uVar37;
            local_1d8 = (BYTE *)0x0;
            pBVar26 = (BYTE *)0x0;
            do {
              local_1c0._0_4_ = uVar24;
              if (((int)local_130 == 0) || (uVar25 = (uint)puVar19, uVar25 < uVar39 + (uVar39 == 0))
                 ) break;
              pBVar17 = local_1d8;
              if (pBVar26 < local_1d8) {
                pBVar17 = pBVar26;
              }
              if (uVar37 <= uVar25) goto LAB_0012cf9f;
              local_130 = (ZSTD_optimal_t *)CONCAT44(local_130._4_4_,(int)local_130 + -1);
              if (pBVar17 + (long)puVar19 < (BYTE *)(ulong)uVar30) goto LAB_0012cfbe;
              pBVar28 = (BYTE *)((long)puVar19 + (long)local_128);
              if ((uVar30 <= uVar25) &&
                 (iVar12 = bcmp(pBVar28,puVar31,(size_t)pBVar17), iVar12 != 0)) goto LAB_0012d078;
              puVar36 = (ulong *)((long)puVar31 + (long)pBVar17);
              puVar42 = (ulong *)(pBVar28 + (long)pBVar17);
              puVar32 = puVar36;
              if (puVar36 < puVar23) {
                uVar33 = *puVar36 ^ *puVar42;
                uVar15 = 0;
                if (uVar33 != 0) {
                  for (; (uVar33 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                  }
                }
                pBVar41 = (BYTE *)(uVar15 >> 3 & 0x1fffffff);
                if (*puVar42 == *puVar36) {
                  do {
                    puVar32 = puVar32 + 1;
                    puVar42 = puVar42 + 1;
                    if (puVar23 <= puVar32) goto LAB_00129672;
                    uVar33 = *puVar32 ^ *puVar42;
                    uVar15 = 0;
                    if (uVar33 != 0) {
                      for (; (uVar33 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                      }
                    }
                    pBVar41 = (BYTE *)((long)puVar32 + ((uVar15 >> 3 & 0x1fffffff) - (long)puVar36))
                    ;
                  } while (*puVar42 == *puVar32);
                }
              }
              else {
LAB_00129672:
                if ((puVar32 < local_110) && ((uint)*puVar42 == (uint)*puVar32)) {
                  puVar32 = (ulong *)((long)puVar32 + 4);
                  puVar42 = (ulong *)((long)puVar42 + 4);
                }
                if ((puVar32 < local_118) && ((short)*puVar42 == (short)*puVar32)) {
                  puVar32 = (ulong *)((long)puVar32 + 2);
                  puVar42 = (ulong *)((long)puVar42 + 2);
                }
                if (puVar32 < iend) {
                  puVar32 = (ulong *)((long)puVar32 + (ulong)((BYTE)*puVar42 == (BYTE)*puVar32));
                }
                pBVar41 = (BYTE *)((long)puVar32 - (long)puVar36);
              }
              pBVar41 = pBVar41 + (long)pBVar17;
              if (local_1a0 < pBVar41) {
                if (uVar35 < uVar25 || uVar35 - uVar25 == 0) goto LAB_0012d097;
                if ((BYTE *)(ulong)(uVar35 - uVar25) < pBVar41) {
                  uVar35 = uVar25 + (U32)pBVar41;
                }
                local_148[uVar24].off = (uVar37 + 2) - uVar25;
                local_148[uVar24].len = (U32)pBVar41;
                uVar24 = uVar24 + 1;
                bVar50 = false;
                local_1a0 = pBVar41;
                if (pBVar41 < (BYTE *)0x1001) {
                  if ((ulong *)((long)puVar31 + (long)pBVar41) != iend) goto LAB_00129746;
LAB_001297c3:
                  bVar50 = false;
                }
              }
              else {
LAB_00129746:
                puVar20 = local_138 + (uVar25 & (uint)local_108) * 2;
                if (pBVar28[(long)pBVar41] < *(byte *)((long)puVar31 + (long)pBVar41)) {
                  *local_188 = uVar25;
                  pBVar26 = pBVar41;
                  if (uVar25 <= uVar18) {
                    bVar50 = false;
                    local_188 = &local_16c;
                    goto LAB_001297d5;
                  }
                  puVar20 = puVar20 + 1;
                  local_188 = puVar20;
                }
                else {
                  *local_1b8 = uVar25;
                  local_1d8 = pBVar41;
                  local_1b8 = puVar20;
                  if (uVar25 <= uVar18) {
                    local_1b8 = &local_16c;
                    goto LAB_001297c3;
                  }
                }
                puVar19 = (uint *)(ulong)*puVar20;
                bVar50 = true;
              }
LAB_001297d5:
              local_1c0._0_4_ = uVar24;
            } while (bVar50);
            *local_1b8 = 0;
            *local_188 = 0;
            if (uVar35 <= local_11c) goto LAB_0012d20b;
            ms->nextToUpdate = uVar35 - 8;
          }
        }
        else if (UVar38 == 5) {
          uVar15 = (ulong)(uVar47 == 0);
          uVar25 = (ms->cParams).targetLength;
          if (0xffe < uVar25) {
            uVar25 = 0xfff;
          }
          local_128 = (ms->window).base;
          uVar35 = iVar12 - (int)local_128;
          local_150 = (uint *)(*puVar31 * -0x30e4432345000000 >>
                              (-(char)(ms->cParams).hashLog & 0x3fU));
          local_138 = ms->chainTable;
          uVar18 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
          uVar24 = uVar35 - uVar18;
          if (uVar35 < uVar18) {
            uVar24 = 0;
          }
          uVar37 = (ms->window).dictLimit;
          uVar39 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          uVar30 = (ms->window).lowLimit;
          uVar29 = uVar35 - uVar39;
          if (uVar35 - uVar30 <= uVar39) {
            uVar29 = uVar30;
          }
          if (ms->loadedDictEnd != 0) {
            uVar29 = uVar30;
          }
          local_108 = CONCAT44(local_108._4_4_,uVar18);
          uVar33 = (ulong)((uVar18 & uVar35) * 2);
          local_188 = local_138 + uVar33;
          local_1b8 = local_138 + uVar33 + 1;
          uVar18 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
          uVar22 = (ulong)uVar18;
          local_130 = (ZSTD_optimal_t *)CONCAT44(local_130._4_4_,uVar18);
          local_168 = (BYTE *)-uVar15;
          bVar50 = true;
          local_158 = ms->hashTable;
          uVar18 = local_158[(long)local_150];
          local_f8 = (U32 *)CONCAT44(local_f8._4_4_,uVar35 + 8);
          uVar30 = uVar35 + 9;
          uVar33 = uVar15 + 3;
          puVar36 = (ulong *)((long)puVar31 + 4);
          local_100 = (ulong *)((long)puVar31 + 0xc);
          local_1a0 = local_d0;
          uVar40 = 0;
          do {
            if (uVar15 == 3) {
              uVar39 = (*local_e8)[0] - 1;
            }
            else {
              uVar39 = (*local_e8)[uVar15];
            }
            if (uVar35 < uVar37) goto LAB_0012cf61;
            if (uVar39 - 1 < uVar35 - uVar37) {
              if ((uint)*puVar31 != *(uint *)((long)puVar31 - (ulong)uVar39)) goto LAB_00129a57;
              puVar42 = (ulong *)((long)puVar36 - (ulong)uVar39);
              puVar32 = puVar36;
              if (puVar36 < local_160) {
                uVar21 = *puVar36 ^ *puVar42;
                uVar44 = 0;
                if (uVar21 != 0) {
                  for (; (uVar21 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                  }
                }
                uVar44 = uVar44 >> 3 & 0x1fffffff;
                iVar12 = (int)uVar44;
                puVar32 = local_100;
                if (*puVar42 == *puVar36) {
                  do {
                    puVar42 = puVar42 + 1;
                    if (local_160 <= puVar32) goto LAB_00129a5e;
                    uVar21 = *puVar42;
                    uVar6 = *puVar32;
                    uVar5 = 0;
                    if ((uVar6 ^ uVar21) != 0) {
                      for (; ((uVar6 ^ uVar21) >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
                      }
                    }
                    puVar46 = (ulong *)((uVar5 >> 3 & 0x1fffffff) + (long)puVar32);
                    puVar32 = puVar32 + 1;
                    if (uVar21 != uVar6) {
                      uVar44 = (long)puVar46 - (long)puVar36;
                      puVar32 = puVar46;
                    }
                    iVar12 = (int)uVar44;
                  } while (uVar21 == uVar6);
                }
              }
              else {
LAB_00129a5e:
                if ((puVar32 < local_110) && ((uint)*puVar42 == (uint)*puVar32)) {
                  puVar32 = (ulong *)((long)puVar32 + 4);
                  puVar42 = (ulong *)((long)puVar42 + 4);
                }
                if ((puVar32 < local_118) && ((short)*puVar42 == (short)*puVar32)) {
                  puVar32 = (ulong *)((long)puVar32 + 2);
                  puVar42 = (ulong *)((long)puVar42 + 2);
                }
                if (puVar32 < iend) {
                  puVar32 = (ulong *)((long)puVar32 + (ulong)((BYTE)*puVar42 == (BYTE)*puVar32));
                }
                iVar12 = (int)puVar32 - (int)puVar36;
              }
              uVar39 = iVar12 + 4;
            }
            else {
              if (uVar35 < uVar29) goto LAB_0012cf80;
LAB_00129a57:
              uVar39 = 0;
            }
            pBVar26 = (BYTE *)(ulong)uVar39;
            bVar7 = true;
            uVar44 = uVar40;
            if (local_1a0 < pBVar26) {
              local_148[uVar40].off = (int)local_168 + (int)uVar15;
              uVar44 = (ulong)((int)uVar40 + 1);
              local_148[uVar40].len = uVar39;
              bVar51 = (ulong *)((long)puVar31 + (long)pBVar26) != iend;
              bVar7 = bVar51 && uVar39 <= uVar25;
              local_1a0 = pBVar26;
              if (!bVar51 || uVar39 > uVar25) {
                uVar22 = uVar44;
              }
            }
            local_1c0._0_4_ = (uint)uVar22;
            if (!bVar7) break;
            uVar15 = uVar15 + 1;
            bVar50 = uVar15 < uVar33;
            uVar40 = uVar44;
          } while (bVar50);
          if (!bVar50) {
            local_158[(long)local_150] = uVar35;
            local_1d8 = (BYTE *)0x0;
            pBVar26 = (BYTE *)0x0;
            do {
              local_1c0._0_4_ = (uint)uVar44;
              if (((int)local_130 == 0) || (uVar18 < uVar29 + (uVar29 == 0))) break;
              pBVar17 = local_1d8;
              if (pBVar26 < local_1d8) {
                pBVar17 = pBVar26;
              }
              if (uVar35 <= uVar18) goto LAB_0012cf9f;
              local_130 = (ZSTD_optimal_t *)CONCAT44(local_130._4_4_,(int)local_130 + -1);
              if (pBVar17 + uVar18 < (BYTE *)(ulong)uVar37) goto LAB_0012cfbe;
              pBVar28 = local_128 + uVar18;
              if ((uVar37 <= uVar18) &&
                 (iVar12 = bcmp(pBVar28,puVar31,(size_t)pBVar17), iVar12 != 0)) goto LAB_0012d078;
              puVar36 = (ulong *)((long)puVar31 + (long)pBVar17);
              puVar42 = (ulong *)(pBVar28 + (long)pBVar17);
              puVar32 = puVar36;
              if (puVar36 < puVar23) {
                uVar33 = *puVar36 ^ *puVar42;
                uVar15 = 0;
                if (uVar33 != 0) {
                  for (; (uVar33 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                  }
                }
                pBVar41 = (BYTE *)(uVar15 >> 3 & 0x1fffffff);
                if (*puVar42 == *puVar36) {
                  do {
                    puVar32 = puVar32 + 1;
                    puVar42 = puVar42 + 1;
                    if (puVar23 <= puVar32) goto LAB_00129c56;
                    uVar33 = *puVar32 ^ *puVar42;
                    uVar15 = 0;
                    if (uVar33 != 0) {
                      for (; (uVar33 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                      }
                    }
                    pBVar41 = (BYTE *)((long)puVar32 + ((uVar15 >> 3 & 0x1fffffff) - (long)puVar36))
                    ;
                  } while (*puVar42 == *puVar32);
                }
              }
              else {
LAB_00129c56:
                if ((puVar32 < local_110) && ((uint)*puVar42 == (uint)*puVar32)) {
                  puVar32 = (ulong *)((long)puVar32 + 4);
                  puVar42 = (ulong *)((long)puVar42 + 4);
                }
                if ((puVar32 < local_118) && ((short)*puVar42 == (short)*puVar32)) {
                  puVar32 = (ulong *)((long)puVar32 + 2);
                  puVar42 = (ulong *)((long)puVar42 + 2);
                }
                if (puVar32 < iend) {
                  puVar32 = (ulong *)((long)puVar32 + (ulong)((BYTE)*puVar42 == (BYTE)*puVar32));
                }
                pBVar41 = (BYTE *)((long)puVar32 - (long)puVar36);
              }
              pBVar41 = pBVar41 + (long)pBVar17;
              if (local_1a0 < pBVar41) {
                if (uVar30 < uVar18 || uVar30 - uVar18 == 0) goto LAB_0012d097;
                if ((BYTE *)(ulong)(uVar30 - uVar18) < pBVar41) {
                  uVar30 = uVar18 + (U32)pBVar41;
                }
                local_148[uVar44].off = (uVar35 + 2) - uVar18;
                local_148[uVar44].len = (U32)pBVar41;
                uVar44 = (ulong)((uint)local_1c0 + 1);
                bVar50 = false;
                local_1a0 = pBVar41;
                if (pBVar41 < (BYTE *)0x1001) {
                  if ((ulong *)((long)puVar31 + (long)pBVar41) != iend) goto LAB_00129d27;
LAB_00129d9e:
                  bVar50 = false;
                }
              }
              else {
LAB_00129d27:
                puVar19 = local_138 + (uVar18 & (uint)local_108) * 2;
                if (pBVar28[(long)pBVar41] < *(byte *)((long)puVar31 + (long)pBVar41)) {
                  *local_188 = uVar18;
                  pBVar26 = pBVar41;
                  if (uVar18 <= uVar24) {
                    bVar50 = false;
                    local_188 = &local_16c;
                    goto LAB_00129db0;
                  }
                  puVar19 = puVar19 + 1;
                  local_188 = puVar19;
                }
                else {
                  *local_1b8 = uVar18;
                  local_1d8 = pBVar41;
                  local_1b8 = puVar19;
                  if (uVar18 <= uVar24) {
                    local_1b8 = &local_16c;
                    goto LAB_00129d9e;
                  }
                }
                uVar18 = *puVar19;
                bVar50 = true;
              }
LAB_00129db0:
              local_1c0._0_4_ = (uint)uVar44;
            } while (bVar50);
LAB_0012a35b:
            *local_1b8 = 0;
            *local_188 = 0;
            if (uVar30 <= (uint)local_f8) goto LAB_0012d20b;
            ms->nextToUpdate = uVar30 - 8;
          }
        }
        else if (UVar38 == 3) {
          uVar15 = (ulong)(uVar47 == 0);
          uVar25 = (ms->cParams).targetLength;
          if (0xffe < uVar25) {
            uVar25 = 0xfff;
          }
          local_128 = (ms->window).base;
          uVar35 = iVar12 - (int)local_128;
          uVar24 = 0;
          local_150 = (uint *)(ulong)((uint)*puVar31 * -0x61c8864f >>
                                     (-(char)(ms->cParams).hashLog & 0x1fU));
          local_138 = ms->chainTable;
          uVar37 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
          uVar18 = uVar35 - uVar37;
          if (uVar35 < uVar37) {
            uVar18 = 0;
          }
          uVar30 = (ms->window).dictLimit;
          uVar29 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          UVar38 = (ms->window).lowLimit;
          UVar11 = uVar35 - uVar29;
          if (uVar35 - UVar38 <= uVar29) {
            UVar11 = UVar38;
          }
          if (ms->loadedDictEnd != 0) {
            UVar11 = UVar38;
          }
          uVar29 = UVar11 + (UVar11 == 0);
          local_108 = CONCAT44(local_108._4_4_,uVar37);
          uVar33 = (ulong)((uVar37 & uVar35) * 2);
          local_188 = local_138 + uVar33;
          local_1b8 = local_138 + uVar33 + 1;
          local_130 = (ZSTD_optimal_t *)
                      CONCAT44(local_130._4_4_,1 << ((byte)(ms->cParams).searchLog & 0x1f));
          bVar50 = true;
          local_158 = ms->hashTable;
          uVar37 = local_158[(long)local_150];
          local_f8 = (U32 *)CONCAT44(local_f8._4_4_,uVar35 + 8);
          local_168 = (BYTE *)CONCAT44(local_168._4_4_,uVar35 + 9);
          uVar33 = uVar15 + 3;
          puVar36 = (ulong *)((long)puVar31 + 3);
          local_100 = (ulong *)((long)puVar31 + 0xb);
          local_1a0 = local_d0;
          local_1c0 = local_100;
          do {
            if (uVar15 == 3) {
              UVar38 = (*local_e8)[0] - 1;
            }
            else {
              UVar38 = (*local_e8)[uVar15];
            }
            if (uVar35 < uVar30) goto LAB_0012cf61;
            if (UVar38 - 1 < uVar35 - uVar30) {
              if (((*(uint *)((long)puVar31 - (ulong)UVar38) ^ (uint)*puVar31) & 0xffffff) != 0)
              goto LAB_00129135;
              puVar42 = (ulong *)((long)puVar36 - (ulong)UVar38);
              puVar32 = puVar36;
              if (puVar36 < local_160) {
                uVar40 = *puVar36 ^ *puVar42;
                uVar22 = 0;
                if (uVar40 != 0) {
                  for (; (uVar40 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                  }
                }
                uVar22 = uVar22 >> 3 & 0x1fffffff;
                iVar12 = (int)uVar22;
                puVar32 = local_100;
                if (*puVar42 == *puVar36) {
                  do {
                    puVar42 = puVar42 + 1;
                    if (local_160 <= puVar32) goto LAB_001291bb;
                    uVar40 = *puVar42;
                    uVar44 = *puVar32;
                    uVar21 = 0;
                    if ((uVar44 ^ uVar40) != 0) {
                      for (; ((uVar44 ^ uVar40) >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                      }
                    }
                    puVar46 = (ulong *)((uVar21 >> 3 & 0x1fffffff) + (long)puVar32);
                    puVar32 = puVar32 + 1;
                    if (uVar40 != uVar44) {
                      uVar22 = (long)puVar46 - (long)puVar36;
                      puVar32 = puVar46;
                    }
                    iVar12 = (int)uVar22;
                  } while (uVar40 == uVar44);
                }
              }
              else {
LAB_001291bb:
                if ((puVar32 < local_110) && ((uint)*puVar42 == (uint)*puVar32)) {
                  puVar32 = (ulong *)((long)puVar32 + 4);
                  puVar42 = (ulong *)((long)puVar42 + 4);
                }
                if ((puVar32 < local_118) && ((short)*puVar42 == (short)*puVar32)) {
                  puVar32 = (ulong *)((long)puVar32 + 2);
                  puVar42 = (ulong *)((long)puVar42 + 2);
                }
                if (puVar32 < iend) {
                  puVar32 = (ulong *)((long)puVar32 + (ulong)((BYTE)*puVar42 == (BYTE)*puVar32));
                }
                iVar12 = (int)puVar32 - (int)puVar36;
              }
              uVar39 = iVar12 + 3;
            }
            else {
              if (uVar35 < UVar11) goto LAB_0012cf80;
LAB_00129135:
              uVar39 = 0;
            }
            pBVar26 = (BYTE *)(ulong)uVar39;
            bVar7 = true;
            if (local_1a0 < pBVar26) {
              local_148[uVar24].off = (int)uVar15 - (uint)(uVar47 == 0);
              uVar27 = uVar24 + 1;
              local_148[uVar24].len = uVar39;
              bVar51 = (ulong *)((long)puVar31 + (long)pBVar26) != iend;
              bVar7 = bVar51 && uVar39 <= uVar25;
              local_1c0 = (ulong *)((ulong)local_1c0 & 0xffffffff);
              uVar24 = uVar27;
              local_1a0 = pBVar26;
              if (!bVar51 || uVar39 > uVar25) {
                local_1c0 = (ulong *)(ulong)uVar27;
              }
            }
            if (!bVar7) break;
            uVar15 = uVar15 + 1;
            bVar50 = uVar15 < uVar33;
          } while (bVar50);
          if (!bVar50) {
            if (local_1a0 < (BYTE *)0x3) {
              UVar38 = ZSTD_insertAndFindFirstIndexHash3(ms,&local_7c,(BYTE *)puVar31);
              bVar50 = true;
              if ((uVar29 <= UVar38) && (uVar35 - UVar38 < 0x40000)) {
                puVar32 = (ulong *)(local_128 + UVar38);
                puVar36 = puVar31;
                if (puVar31 < puVar23) {
                  uVar33 = *puVar31 ^ *puVar32;
                  uVar15 = 0;
                  if (uVar33 != 0) {
                    for (; (uVar33 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                    }
                  }
                  pBVar26 = (BYTE *)(uVar15 >> 3 & 0x1fffffff);
                  if (*puVar32 == *puVar31) {
                    do {
                      puVar36 = puVar36 + 1;
                      puVar32 = puVar32 + 1;
                      if (puVar23 <= puVar36) goto LAB_0012a47f;
                      uVar33 = *puVar36 ^ *puVar32;
                      uVar15 = 0;
                      if (uVar33 != 0) {
                        for (; (uVar33 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                        }
                      }
                      pBVar26 = (BYTE *)((long)puVar36 +
                                        ((uVar15 >> 3 & 0x1fffffff) - (long)puVar31));
                    } while (*puVar32 == *puVar36);
                  }
                }
                else {
LAB_0012a47f:
                  if ((puVar36 < local_110) && ((uint)*puVar32 == (uint)*puVar36)) {
                    puVar36 = (ulong *)((long)puVar36 + 4);
                    puVar32 = (ulong *)((long)puVar32 + 4);
                  }
                  if ((puVar36 < local_118) && ((short)*puVar32 == (short)*puVar36)) {
                    puVar36 = (ulong *)((long)puVar36 + 2);
                    puVar32 = (ulong *)((long)puVar32 + 2);
                  }
                  if (puVar36 < iend) {
                    puVar36 = (ulong *)((long)puVar36 + (ulong)((BYTE)*puVar32 == (BYTE)*puVar36));
                  }
                  pBVar26 = (BYTE *)((long)puVar36 - (long)puVar31);
                }
                if ((BYTE *)0x2 < pBVar26) {
                  if (uVar35 <= UVar38) {
LAB_0012d268:
                    __assert_fail("current > matchIndex3",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                  ,0x4806,
                                  "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                 );
                  }
                  if (uVar24 != 0) {
LAB_0012d287:
                    __assert_fail("mnum==0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                  ,0x4807,
                                  "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                 );
                  }
                  local_148->off = (uVar35 - UVar38) + 2;
                  local_148->len = (U32)pBVar26;
                  local_1a0 = pBVar26;
                  if (((BYTE *)(ulong)uVar25 < pBVar26) ||
                     (uVar24 = 1, (ulong *)((long)puVar31 + (long)pBVar26) == iend)) {
                    ms->nextToUpdate = uVar35 + 1;
                    uVar24 = 1;
                    bVar50 = false;
                    local_1c0._0_4_ = 1;
                  }
                }
              }
              if (!bVar50) goto LAB_0012a820;
            }
            local_158[(long)local_150] = uVar35;
            local_1c0 = (ulong *)(ulong)uVar24;
            local_1d8 = (BYTE *)0x0;
            pBVar26 = (BYTE *)0x0;
            do {
              if (((int)local_130 == 0) || (uVar37 < uVar29)) break;
              pBVar17 = local_1d8;
              if (pBVar26 < local_1d8) {
                pBVar17 = pBVar26;
              }
              if (uVar35 <= uVar37) goto LAB_0012cf9f;
              local_130 = (ZSTD_optimal_t *)CONCAT44(local_130._4_4_,(int)local_130 + -1);
              if (pBVar17 + uVar37 < (BYTE *)(ulong)uVar30) goto LAB_0012cfbe;
              pBVar28 = local_128 + uVar37;
              if ((uVar30 <= uVar37) &&
                 (iVar12 = bcmp(pBVar28,puVar31,(size_t)pBVar17), iVar12 != 0)) goto LAB_0012d078;
              puVar36 = (ulong *)((long)puVar31 + (long)pBVar17);
              puVar42 = (ulong *)(pBVar28 + (long)pBVar17);
              puVar32 = puVar36;
              if (puVar36 < puVar23) {
                uVar33 = *puVar36 ^ *puVar42;
                uVar15 = 0;
                if (uVar33 != 0) {
                  for (; (uVar33 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                  }
                }
                pBVar41 = (BYTE *)(uVar15 >> 3 & 0x1fffffff);
                if (*puVar42 == *puVar36) {
                  do {
                    puVar32 = puVar32 + 1;
                    puVar42 = puVar42 + 1;
                    if (puVar23 <= puVar32) goto LAB_0012a674;
                    uVar33 = *puVar32 ^ *puVar42;
                    uVar15 = 0;
                    if (uVar33 != 0) {
                      for (; (uVar33 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                      }
                    }
                    pBVar41 = (BYTE *)((long)puVar32 + ((uVar15 >> 3 & 0x1fffffff) - (long)puVar36))
                    ;
                  } while (*puVar42 == *puVar32);
                }
              }
              else {
LAB_0012a674:
                if ((puVar32 < local_110) && ((uint)*puVar42 == (uint)*puVar32)) {
                  puVar32 = (ulong *)((long)puVar32 + 4);
                  puVar42 = (ulong *)((long)puVar42 + 4);
                }
                if ((puVar32 < local_118) && ((short)*puVar42 == (short)*puVar32)) {
                  puVar32 = (ulong *)((long)puVar32 + 2);
                  puVar42 = (ulong *)((long)puVar42 + 2);
                }
                if (puVar32 < iend) {
                  puVar32 = (ulong *)((long)puVar32 + (ulong)((BYTE)*puVar42 == (BYTE)*puVar32));
                }
                pBVar41 = (BYTE *)((long)puVar32 - (long)puVar36);
              }
              pBVar41 = pBVar41 + (long)pBVar17;
              if (local_1a0 < pBVar41) {
                if ((uint)local_168 < uVar37 || (uint)local_168 - uVar37 == 0) goto LAB_0012d097;
                uVar25 = (uint)local_168;
                if ((BYTE *)(ulong)((uint)local_168 - uVar37) < pBVar41) {
                  uVar25 = uVar37 + (U32)pBVar41;
                }
                local_168 = (BYTE *)CONCAT44(local_168._4_4_,uVar25);
                local_148[(long)local_1c0].off = (uVar35 + 2) - uVar37;
                local_148[(long)local_1c0].len = (U32)pBVar41;
                local_1c0 = (ulong *)(ulong)((uint)local_1c0 + 1);
                bVar50 = false;
                local_1a0 = pBVar41;
                if (pBVar41 < (BYTE *)0x1001) {
                  if ((ulong *)((long)puVar31 + (long)pBVar41) != iend) goto LAB_0012a756;
LAB_0012a7d3:
                  bVar50 = false;
                }
              }
              else {
LAB_0012a756:
                puVar19 = local_138 + (uVar37 & (uint)local_108) * 2;
                if (pBVar28[(long)pBVar41] < *(byte *)((long)puVar31 + (long)pBVar41)) {
                  *local_188 = uVar37;
                  pBVar26 = pBVar41;
                  if (uVar37 <= uVar18) {
                    bVar50 = false;
                    local_188 = &local_16c;
                    goto LAB_0012a7e5;
                  }
                  puVar19 = puVar19 + 1;
                  local_188 = puVar19;
                }
                else {
                  *local_1b8 = uVar37;
                  local_1d8 = pBVar41;
                  local_1b8 = puVar19;
                  if (uVar37 <= uVar18) {
                    local_1b8 = &local_16c;
                    goto LAB_0012a7d3;
                  }
                }
                uVar37 = *puVar19;
                bVar50 = true;
              }
LAB_0012a7e5:
            } while (bVar50);
            *local_1b8 = 0;
            *local_188 = 0;
            if ((uint)local_168 <= (uint)local_f8) {
LAB_0012d20b:
              __assert_fail("matchEndIdx > current+8",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x4873,
                            "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                           );
            }
            ms->nextToUpdate = (uint)local_168 - 8;
          }
        }
        else {
          uVar15 = (ulong)(uVar47 == 0);
          uVar25 = (ms->cParams).targetLength;
          if (0xffe < uVar25) {
            uVar25 = 0xfff;
          }
          local_128 = (ms->window).base;
          uVar35 = iVar12 - (int)local_128;
          local_150 = (uint *)(ulong)((uint)*puVar31 * -0x61c8864f >>
                                     (-(char)(ms->cParams).hashLog & 0x1fU));
          local_138 = ms->chainTable;
          uVar18 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
          uVar24 = uVar35 - uVar18;
          if (uVar35 < uVar18) {
            uVar24 = 0;
          }
          uVar37 = (ms->window).dictLimit;
          uVar39 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          uVar30 = (ms->window).lowLimit;
          uVar29 = uVar35 - uVar39;
          if (uVar35 - uVar30 <= uVar39) {
            uVar29 = uVar30;
          }
          if (ms->loadedDictEnd != 0) {
            uVar29 = uVar30;
          }
          local_108 = CONCAT44(local_108._4_4_,uVar18);
          uVar33 = (ulong)((uVar18 & uVar35) * 2);
          local_188 = local_138 + uVar33;
          local_1b8 = local_138 + uVar33 + 1;
          uVar18 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
          uVar22 = (ulong)uVar18;
          local_130 = (ZSTD_optimal_t *)CONCAT44(local_130._4_4_,uVar18);
          local_168 = (BYTE *)-uVar15;
          bVar50 = true;
          local_158 = ms->hashTable;
          uVar18 = local_158[(long)local_150];
          local_f8 = (U32 *)CONCAT44(local_f8._4_4_,uVar35 + 8);
          uVar30 = uVar35 + 9;
          uVar33 = uVar15 + 3;
          puVar36 = (ulong *)((long)puVar31 + 4);
          local_100 = (ulong *)((long)puVar31 + 0xc);
          local_1a0 = local_d0;
          uVar40 = 0;
          do {
            if (uVar15 == 3) {
              uVar39 = (*local_e8)[0] - 1;
            }
            else {
              uVar39 = (*local_e8)[uVar15];
            }
            if (uVar35 < uVar37) {
LAB_0012cf61:
              __assert_fail("current >= dictLimit",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x47d0,
                            "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                           );
            }
            if (uVar39 - 1 < uVar35 - uVar37) {
              if ((uint)*puVar31 != *(uint *)((long)puVar31 - (ulong)uVar39)) goto LAB_00129ff7;
              puVar42 = (ulong *)((long)puVar36 - (ulong)uVar39);
              puVar32 = puVar36;
              if (puVar36 < local_160) {
                uVar21 = *puVar36 ^ *puVar42;
                uVar44 = 0;
                if (uVar21 != 0) {
                  for (; (uVar21 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                  }
                }
                uVar44 = uVar44 >> 3 & 0x1fffffff;
                iVar12 = (int)uVar44;
                puVar32 = local_100;
                if (*puVar42 == *puVar36) {
                  do {
                    puVar42 = puVar42 + 1;
                    if (local_160 <= puVar32) goto LAB_00129ffe;
                    uVar21 = *puVar42;
                    uVar6 = *puVar32;
                    uVar5 = 0;
                    if ((uVar6 ^ uVar21) != 0) {
                      for (; ((uVar6 ^ uVar21) >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
                      }
                    }
                    puVar46 = (ulong *)((uVar5 >> 3 & 0x1fffffff) + (long)puVar32);
                    puVar32 = puVar32 + 1;
                    if (uVar21 != uVar6) {
                      uVar44 = (long)puVar46 - (long)puVar36;
                      puVar32 = puVar46;
                    }
                    iVar12 = (int)uVar44;
                  } while (uVar21 == uVar6);
                }
              }
              else {
LAB_00129ffe:
                if ((puVar32 < local_110) && ((uint)*puVar42 == (uint)*puVar32)) {
                  puVar32 = (ulong *)((long)puVar32 + 4);
                  puVar42 = (ulong *)((long)puVar42 + 4);
                }
                if ((puVar32 < local_118) && ((short)*puVar42 == (short)*puVar32)) {
                  puVar32 = (ulong *)((long)puVar32 + 2);
                  puVar42 = (ulong *)((long)puVar42 + 2);
                }
                if (puVar32 < iend) {
                  puVar32 = (ulong *)((long)puVar32 + (ulong)((BYTE)*puVar42 == (BYTE)*puVar32));
                }
                iVar12 = (int)puVar32 - (int)puVar36;
              }
              uVar39 = iVar12 + 4;
            }
            else {
              if (uVar35 < uVar29) {
LAB_0012cf80:
                __assert_fail("current >= windowLow",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x47d9,
                              "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                             );
              }
LAB_00129ff7:
              uVar39 = 0;
            }
            pBVar26 = (BYTE *)(ulong)uVar39;
            bVar7 = true;
            uVar44 = uVar40;
            if (local_1a0 < pBVar26) {
              local_148[uVar40].off = (int)local_168 + (int)uVar15;
              uVar44 = (ulong)((int)uVar40 + 1);
              local_148[uVar40].len = uVar39;
              bVar51 = (ulong *)((long)puVar31 + (long)pBVar26) != iend;
              bVar7 = bVar51 && uVar39 <= uVar25;
              local_1a0 = pBVar26;
              if (!bVar51 || uVar39 > uVar25) {
                uVar22 = uVar44;
              }
            }
            local_1c0._0_4_ = (uint)uVar22;
            if (!bVar7) break;
            uVar15 = uVar15 + 1;
            bVar50 = uVar15 < uVar33;
            uVar40 = uVar44;
          } while (bVar50);
          if (!bVar50) {
            local_158[(long)local_150] = uVar35;
            local_1d8 = (BYTE *)0x0;
            pBVar26 = (BYTE *)0x0;
            do {
              local_1c0._0_4_ = (uint)uVar44;
              if (((int)local_130 == 0) || (uVar18 < uVar29 + (uVar29 == 0))) break;
              pBVar17 = local_1d8;
              if (pBVar26 < local_1d8) {
                pBVar17 = pBVar26;
              }
              if (uVar35 <= uVar18) {
LAB_0012cf9f:
                __assert_fail("current > matchIndex",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x4819,
                              "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                             );
              }
              local_130 = (ZSTD_optimal_t *)CONCAT44(local_130._4_4_,(int)local_130 + -1);
              if (pBVar17 + uVar18 < (BYTE *)(ulong)uVar37) {
LAB_0012cfbe:
                __assert_fail("matchIndex+matchLength >= dictLimit",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x481c,
                              "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                             );
              }
              pBVar28 = local_128 + uVar18;
              if ((uVar37 <= uVar18) &&
                 (iVar12 = bcmp(pBVar28,puVar31,(size_t)pBVar17), iVar12 != 0)) {
LAB_0012d078:
                __assert_fail("memcmp(match, ip, matchLength) == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x481e,
                              "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                             );
              }
              puVar36 = (ulong *)((long)puVar31 + (long)pBVar17);
              puVar42 = (ulong *)(pBVar28 + (long)pBVar17);
              puVar32 = puVar36;
              if (puVar36 < puVar23) {
                uVar33 = *puVar36 ^ *puVar42;
                uVar15 = 0;
                if (uVar33 != 0) {
                  for (; (uVar33 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                  }
                }
                pBVar41 = (BYTE *)(uVar15 >> 3 & 0x1fffffff);
                if (*puVar42 == *puVar36) {
                  do {
                    puVar32 = puVar32 + 1;
                    puVar42 = puVar42 + 1;
                    if (puVar23 <= puVar32) goto LAB_0012a1f6;
                    uVar33 = *puVar32 ^ *puVar42;
                    uVar15 = 0;
                    if (uVar33 != 0) {
                      for (; (uVar33 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                      }
                    }
                    pBVar41 = (BYTE *)((long)puVar32 + ((uVar15 >> 3 & 0x1fffffff) - (long)puVar36))
                    ;
                  } while (*puVar42 == *puVar32);
                }
              }
              else {
LAB_0012a1f6:
                if ((puVar32 < local_110) && ((uint)*puVar42 == (uint)*puVar32)) {
                  puVar32 = (ulong *)((long)puVar32 + 4);
                  puVar42 = (ulong *)((long)puVar42 + 4);
                }
                if ((puVar32 < local_118) && ((short)*puVar42 == (short)*puVar32)) {
                  puVar32 = (ulong *)((long)puVar32 + 2);
                  puVar42 = (ulong *)((long)puVar42 + 2);
                }
                if (puVar32 < iend) {
                  puVar32 = (ulong *)((long)puVar32 + (ulong)((BYTE)*puVar42 == (BYTE)*puVar32));
                }
                pBVar41 = (BYTE *)((long)puVar32 - (long)puVar36);
              }
              pBVar41 = pBVar41 + (long)pBVar17;
              if (local_1a0 < pBVar41) {
                if (uVar30 < uVar18 || uVar30 - uVar18 == 0) {
LAB_0012d097:
                  __assert_fail("matchEndIdx > matchIndex",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x482b,
                                "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                               );
                }
                if ((BYTE *)(ulong)(uVar30 - uVar18) < pBVar41) {
                  uVar30 = uVar18 + (U32)pBVar41;
                }
                local_148[uVar44].off = (uVar35 + 2) - uVar18;
                local_148[uVar44].len = (U32)pBVar41;
                uVar44 = (ulong)((uint)local_1c0 + 1);
                bVar50 = false;
                local_1a0 = pBVar41;
                if (pBVar41 < (BYTE *)0x1001) {
                  if ((ulong *)((long)puVar31 + (long)pBVar41) != iend) goto LAB_0012a2c7;
LAB_0012a33e:
                  bVar50 = false;
                }
              }
              else {
LAB_0012a2c7:
                puVar19 = local_138 + (uVar18 & (uint)local_108) * 2;
                if (pBVar28[(long)pBVar41] < *(byte *)((long)puVar31 + (long)pBVar41)) {
                  *local_188 = uVar18;
                  pBVar26 = pBVar41;
                  if (uVar18 <= uVar24) {
                    bVar50 = false;
                    local_188 = &local_16c;
                    goto LAB_0012a350;
                  }
                  puVar19 = puVar19 + 1;
                  local_188 = puVar19;
                }
                else {
                  *local_1b8 = uVar18;
                  local_1d8 = pBVar41;
                  local_1b8 = puVar19;
                  if (uVar18 <= uVar24) {
                    local_1b8 = &local_16c;
                    goto LAB_0012a33e;
                  }
                }
                uVar18 = *puVar19;
                bVar50 = true;
              }
LAB_0012a350:
              local_1c0._0_4_ = (uint)uVar44;
            } while (bVar50);
            goto LAB_0012a35b;
          }
        }
      }
LAB_0012a820:
      pZVar43 = local_98;
      if ((uint)local_1c0 == 0) {
        puVar31 = (ulong *)((long)puVar31 + 1);
        uVar15 = 0;
        iVar12 = 2;
      }
      else {
        lVar16 = 0;
        do {
          local_98->rep[lVar16] = (*local_e8)[lVar16];
          lVar16 = lVar16 + 1;
        } while (lVar16 != 3);
        local_98->mlen = 0;
        local_98->litlen = uVar47;
        UVar38 = ZSTD_litLengthPrice(uVar47,local_a0,2);
        pZVar43->price = UVar38;
        uVar25 = local_148[(uint)local_1c0 - 1].len;
        if (local_ac < uVar25) {
          local_d4 = local_148[(uint)local_1c0 - 1].off;
          uVar24 = uVar25 + uVar47;
          local_a8 = (ZSTD_optimal_t *)0x0;
          iVar12 = 7;
          local_88 = (ZSTD_optimal_t *)(ulong)uVar25;
          local_90 = (ZSTD_optimal_t *)(ulong)uVar47;
        }
        else {
          UVar11 = ZSTD_litLengthPrice(0,local_a0,2);
          uVar15 = 1;
          pZVar49 = local_60;
          do {
            pZVar49->price = 0x40000000;
            uVar15 = uVar15 + 1;
            pZVar49 = pZVar49 + 1;
          } while (local_48 != uVar15);
          uVar33 = 0;
          do {
            uVar25 = local_148[uVar33].len;
            if ((uint)uVar15 <= uVar25) {
              UVar13 = local_148[uVar33].off;
              if (UVar13 == 0xffffffff) {
LAB_0012cf04:
                __assert_fail("val != 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x12c2,"U32 ZSTD_highbit32(U32)");
              }
              uVar24 = 0x1f;
              if (UVar13 + 1 != 0) {
                for (; UVar13 + 1 >> uVar24 == 0; uVar24 = uVar24 - 1) {
                }
              }
              uVar18 = (uint)uVar15 * 0x100 - 0x200;
              do {
                uVar35 = (uint)uVar15;
                if (uVar35 < 3) {
LAB_0012cf23:
                  __assert_fail("matchLength >= MINMATCH",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x469f,
                                "U32 ZSTD_getMatchPrice(const U32, const U32, const optState_t *const, const int)"
                               );
                }
                if ((ms->opt).priceType == zop_predef) {
                  uVar37 = 0x1f;
                  if (uVar35 - 2 != 0) {
                    for (; uVar35 - 2 >> uVar37 == 0; uVar37 = uVar37 - 1) {
                    }
                  }
                  if (0x16 < uVar37) goto LAB_0012cee5;
                  iVar12 = (uVar37 + uVar24) * 0x100 + (uVar18 >> ((byte)uVar37 & 0x1f)) + 0x1000;
                }
                else {
                  uVar37 = (ms->opt).offCodeFreq[uVar24] + 1;
                  if (uVar37 == 0) goto LAB_0012cf04;
                  uVar30 = 0x1f;
                  if (uVar37 != 0) {
                    for (; uVar37 >> uVar30 == 0; uVar30 = uVar30 - 1) {
                    }
                  }
                  if (0x16 < uVar30) {
LAB_0012cee5:
                    __assert_fail("hb + BITCOST_ACCURACY < 31",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                  ,0x45cb,"U32 ZSTD_fracWeight(U32)");
                  }
                  uVar29 = uVar35 - 3;
                  if (uVar29 < 0x80) {
                    uVar29 = (uint)(byte)(&ZSTD_MLcode(unsigned_int)::ML_Code)[uVar29];
                  }
                  else {
                    uVar39 = 0x1f;
                    if (uVar29 != 0) {
                      for (; uVar29 >> uVar39 == 0; uVar39 = uVar39 - 1) {
                      }
                    }
                    uVar29 = (uVar39 ^ 0xffffffe0) + 0x44;
                  }
                  uVar39 = (ms->opt).matchLengthFreq[uVar29] + 1;
                  if (uVar39 == 0) goto LAB_0012cf04;
                  uVar27 = 0x1f;
                  if (uVar39 != 0) {
                    for (; uVar39 >> uVar27 == 0; uVar27 = uVar27 - 1) {
                    }
                  }
                  if (0x16 < uVar27) goto LAB_0012cee5;
                  iVar12 = ((ML_bits[uVar29] + uVar24) - (uVar30 + uVar27)) * 0x100 +
                           (((ms->opt).matchLengthSumBasePrice + (ms->opt).offCodeSumBasePrice) -
                           ((uVar37 * 0x100 >> ((byte)uVar30 & 0x1f)) +
                           (uVar39 * 0x100 >> ((byte)uVar27 & 0x1f)))) + 0x33;
                  pZVar43 = local_98;
                }
                uVar15 = uVar15 & 0xffffffff;
                pZVar43[uVar15].mlen = uVar35;
                pZVar43[uVar15].off = UVar13;
                pZVar43[uVar15].litlen = uVar47;
                pZVar43[uVar15].price = iVar12 + UVar11 + UVar38;
                uVar15 = (ulong)(uVar35 + 1);
                uVar18 = uVar18 + 0x100;
              } while (uVar35 + 1 <= uVar25);
            }
            uVar33 = uVar33 + 1;
          } while (uVar33 != (uint)local_1c0 + ((uint)local_1c0 == 0));
          uVar24 = (int)uVar15 - 1;
          iVar12 = 0;
        }
        uVar15 = (ulong)uVar24;
      }
      pZVar49 = local_a8;
      if (iVar12 == 7) {
LAB_0012cb2c:
        paUVar10 = local_e8;
        if (pZVar43->mlen != 0) {
          __assert_fail("opt[0].mlen == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x4998,
                        "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                       );
        }
        iVar12 = (int)pZVar49;
        if ((int)local_88 == 0) {
          (*local_e8)[2] = pZVar43[(ulong)pZVar49 & 0xffffffff].rep[2];
          *(undefined8 *)*local_e8 = *(undefined8 *)pZVar43[(ulong)pZVar49 & 0xffffffff].rep;
        }
        else {
          rVar52 = ZSTD_updateRep(pZVar43[(ulong)pZVar49 & 0xffffffff].rep,local_d4,
                                  (uint)((int)local_90 == 0));
          *paUVar10 = rVar52.rep;
        }
        uVar47 = iVar12 + 1;
        if (0xfff < uVar47) {
          __assert_fail("storeEnd < ZSTD_OPT_NUM",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x49ab,
                        "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                       );
        }
        uVar33 = (ulong)uVar47;
        pZVar43[uVar33].price = local_70;
        pZVar43[uVar33].off = local_d4;
        pZVar43[uVar33].mlen = (U32)local_88;
        pZVar43[uVar33].litlen = (U32)local_90;
        *(undefined8 *)pZVar43[uVar33].rep = local_58;
        pZVar43[uVar33].rep[2] = local_50;
        uVar15 = (ulong)pZVar49 & 0xffffffff;
        uVar22 = (ulong)pZVar49 & 0xffffffff;
        uVar25 = uVar47;
        if (iVar12 != 0) {
          do {
            uVar24 = (uint)uVar22;
            uVar18 = pZVar43[uVar22].litlen + pZVar43[uVar22].mlen;
            uVar25 = (uint)uVar15;
            pZVar48 = pZVar43 + uVar22;
            iVar9 = pZVar48->price;
            UVar11 = pZVar48->off;
            UVar13 = pZVar48->mlen;
            UVar14 = pZVar48->litlen;
            pZVar48 = pZVar43 + uVar22;
            UVar38 = pZVar48->rep[0];
            uVar8 = *(undefined8 *)(&pZVar48->litlen + 2);
            pZVar1 = pZVar43 + uVar15;
            pZVar1->litlen = pZVar48->litlen;
            pZVar1->rep[0] = UVar38;
            *(undefined8 *)(&pZVar1->litlen + 2) = uVar8;
            pZVar48 = pZVar43 + uVar15;
            pZVar48->price = iVar9;
            pZVar48->off = UVar11;
            pZVar48->mlen = UVar13;
            pZVar48->litlen = UVar14;
            uVar15 = (ulong)(uVar25 - 1);
            uVar22 = (ulong)(uVar24 - uVar18);
            if (uVar18 > uVar24) {
              uVar22 = 0;
            }
          } while (uVar18 <= uVar24 && uVar24 - uVar18 != 0);
        }
        local_a8 = pZVar49;
        if (uVar25 <= uVar47) {
          uVar15 = (ulong)uVar25;
          do {
            uVar47 = pZVar43[uVar15].litlen;
            uVar22 = (ulong)uVar47;
            UVar38 = pZVar43[uVar15].mlen;
            if (UVar38 == 0) {
              if (uVar15 != uVar33) {
                __assert_fail("storePos == storeEnd",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x49c4,
                              "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                             );
              }
              puVar31 = (ulong *)(uVar22 + (long)local_e0);
            }
            else {
              puVar31 = (ulong *)((long)local_e0 + uVar22);
              if (iend < puVar31) {
                __assert_fail("anchor + llen <= iend",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x49c9,
                              "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                             );
              }
              UVar11 = pZVar43[uVar15].off;
              ZSTD_updateStats(local_a0,uVar47,(BYTE *)local_e0,UVar11,UVar38);
              if (local_68->maxNbSeq <=
                  (ulong)((long)local_68->sequences - (long)local_68->sequencesStart >> 3)) {
                __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x2038,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              if (0x20000 < local_68->maxNbLit) {
                __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x203a,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              puVar23 = (ulong *)local_68->lit;
              if (local_68->litStart + local_68->maxNbLit < (BYTE *)((long)puVar23 + uVar22)) {
                __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x203b,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              if (local_40 < puVar31) {
                ZSTD_safecopyLiterals
                          ((BYTE *)puVar23,(BYTE *)local_e0,(BYTE *)puVar31,(BYTE *)local_40);
              }
              else {
                uVar40 = local_e0[1];
                *puVar23 = *local_e0;
                puVar23[1] = uVar40;
                if (0x10 < uVar47) {
                  pBVar26 = local_68->lit;
                  puVar31 = (ulong *)(pBVar26 + 0x10);
                  puVar23 = local_e0 + 2;
                  if (0xffffffffffffffe8 < (ulong)((long)puVar31 + (-8 - (long)puVar23))) {
                    __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                  ,0x1268,
                                  "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                                 );
                  }
                  if (0xffffffffffffffe0 < (ulong)((long)puVar31 + (-0x10 - (long)puVar23))) {
                    __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                  ,0x1270,
                                  "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                                 );
                  }
                  uVar40 = local_e0[3];
                  *puVar31 = *puVar23;
                  *(ulong *)(pBVar26 + 0x18) = uVar40;
                  if (0x20 < uVar47) {
                    lVar16 = 0;
                    do {
                      puVar3 = (undefined8 *)((long)local_e0 + lVar16 + 0x20);
                      uVar8 = puVar3[1];
                      pBVar17 = pBVar26 + lVar16 + 0x20;
                      *(undefined8 *)pBVar17 = *puVar3;
                      *(undefined8 *)(pBVar17 + 8) = uVar8;
                      puVar3 = (undefined8 *)((long)local_e0 + lVar16 + 0x30);
                      uVar8 = puVar3[1];
                      *(undefined8 *)(pBVar17 + 0x10) = *puVar3;
                      *(undefined8 *)(pBVar17 + 0x18) = uVar8;
                      lVar16 = lVar16 + 0x20;
                    } while (pBVar17 + 0x20 < pBVar26 + uVar22);
                  }
                }
              }
              local_68->lit = local_68->lit + uVar22;
              if (0xffff < uVar47) {
                if (local_68->longLengthID != 0) {
                  __assert_fail("seqStorePtr->longLengthID == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x204d,
                                "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                               );
                }
                local_68->longLengthID = 1;
                local_68->longLengthPos =
                     (U32)((ulong)((long)local_68->sequences - (long)local_68->sequencesStart) >> 3)
                ;
              }
              psVar4 = local_68->sequences;
              psVar4->litLength = (U16)uVar47;
              psVar4->offset = UVar11 + 1;
              if (0xffff < UVar38 - 3) {
                if (local_68->longLengthID != 0) {
                  __assert_fail("seqStorePtr->longLengthID == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x2058,
                                "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                               );
                }
                local_68->longLengthID = 2;
                local_68->longLengthPos =
                     (U32)((ulong)((long)psVar4 - (long)local_68->sequencesStart) >> 3);
              }
              psVar4->matchLength = (U16)(UVar38 - 3);
              local_68->sequences = psVar4 + 1;
              puVar31 = (ulong *)((long)local_e0 + (ulong)(UVar38 + uVar47));
              local_e0 = puVar31;
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 != iVar12 + 2);
        }
        ZSTD_setBasePrices(local_a0,2);
        pZVar49 = local_a8;
      }
      else if (iVar12 == 0) {
        if ((int)uVar15 != 0) {
          pZVar48 = (ZSTD_optimal_t *)0x1;
          do {
            optPtr = local_a0;
            if (0xfff < (uint)pZVar48) {
              __assert_fail("cur < ZSTD_OPT_NUM",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x4928,
                            "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                           );
            }
            uVar47 = (uint)pZVar48 - 1;
            pZVar1 = pZVar43 + uVar47;
            UVar38 = 1;
            if (pZVar43[uVar47].mlen == 0) {
              UVar38 = pZVar1->litlen + 1;
            }
            puVar23 = (ulong *)((long)puVar31 + (long)pZVar48);
            iVar12 = pZVar1->price;
            local_a8 = pZVar48;
            UVar11 = ZSTD_rawLiteralsCost
                               ((BYTE *)((long)puVar23 + -1),(U32)local_a0,(optState_t *)0x2,iVar12)
            ;
            UVar13 = ZSTD_litLengthPrice(UVar38,optPtr,2);
            UVar14 = ZSTD_litLengthPrice(UVar38 - 1,optPtr,2);
            pZVar43 = local_98;
            pZVar49 = local_a8;
            iVar12 = (UVar13 + UVar11 + iVar12) - UVar14;
            if (999999999 < iVar12) {
              __assert_fail("price < 1000000000",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x4931,
                            "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                           );
            }
            pZVar2 = local_98 + (long)pZVar48;
            if (iVar12 <= local_98[(long)pZVar48].price) {
              pZVar2->off = 0;
              pZVar2->mlen = 0;
              pZVar2->litlen = UVar38;
              pZVar2->price = iVar12;
            }
            uVar47 = pZVar2->mlen;
            uVar25 = (uint)local_a8;
            if (uVar25 < uVar47) {
              __assert_fail("cur >= opt[cur].mlen",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x4947,
                            "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                           );
            }
            if (uVar47 == 0) {
              pZVar2->rep[2] = pZVar1->rep[2];
              *(undefined8 *)pZVar2->rep = *(undefined8 *)pZVar1->rep;
            }
            else {
              rVar52 = ZSTD_updateRep(local_98[uVar25 - uVar47].rep,pZVar2->off,
                                      (uint)(pZVar2->litlen == 0));
              *&pZVar2->rep = rVar52.rep;
            }
            uVar47 = 0x13;
            if (puVar23 <= local_78) {
              if (uVar25 == (uint)uVar15) {
                uVar47 = 0x11;
              }
              else {
                UVar38 = pZVar2->mlen;
                local_1a0._0_4_ = 0;
                if (UVar38 == 0) {
                  local_1a0._0_4_ = pZVar2->litlen;
                }
                local_6c = pZVar2->price;
                local_130 = pZVar2;
                UVar11 = ZSTD_litLengthPrice(0,local_a0,2);
                pBVar26 = (ms->window).base;
                uVar33 = (ulong)ms->nextToUpdate;
                uVar24 = 0;
                if (pBVar26 + uVar33 <= puVar23) {
                  UVar13 = (ms->cParams).minMatch;
                  while( true ) {
                    puVar36 = local_160;
                    uVar47 = (uint)uVar33;
                    uVar24 = (uint)((long)puVar23 - (long)pBVar26);
                    if (uVar24 <= uVar47) break;
                    UVar14 = ZSTD_insertBt1(ms,pBVar26 + uVar33,(BYTE *)iend,UVar13,0);
                    uVar33 = (ulong)(UVar14 + uVar47);
                    if (UVar14 + uVar47 <= uVar47) goto LAB_0012cf42;
                  }
                  if ((ulong)((long)puVar23 - (long)pBVar26) >> 0x20 != 0) goto LAB_0012d18f;
                  if ((ulong)((long)iend - (long)pBVar26) >> 0x20 != 0) goto LAB_0012d1ae;
                  ms->nextToUpdate = uVar24;
                  iVar12 = (int)puVar23;
                  if (UVar13 - 6 < 2) {
                    uVar33 = (ulong)(UVar38 != 0);
                    uVar47 = (ms->cParams).targetLength;
                    if (0xffe < uVar47) {
                      uVar47 = 0xfff;
                    }
                    local_138 = (U32 *)CONCAT44(local_138._4_4_,uVar47);
                    local_100 = (ulong *)(ms->window).base;
                    uVar35 = iVar12 - (int)local_100;
                    pBVar26 = (BYTE *)(ulong)uVar35;
                    local_c0 = *puVar23 * -0x30e4432340650000 >>
                               (-(char)(ms->cParams).hashLog & 0x3fU);
                    local_f8 = ms->chainTable;
                    local_11c = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
                    local_13c = uVar35 - local_11c;
                    uVar18 = 0;
                    if (uVar35 < local_11c) {
                      local_13c = 0;
                    }
                    uVar37 = (ms->window).dictLimit;
                    uVar29 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
                    uVar24 = (ms->window).lowLimit;
                    uVar30 = uVar35 - uVar29;
                    if (uVar35 - uVar24 <= uVar29) {
                      uVar30 = uVar24;
                    }
                    if (ms->loadedDictEnd != 0) {
                      uVar30 = uVar24;
                    }
                    uVar22 = (ulong)((local_11c & uVar35) * 2);
                    local_158 = local_f8 + uVar22;
                    local_150 = local_f8 + uVar22 + 1;
                    local_168 = (BYTE *)CONCAT44(local_168._4_4_,
                                                 1 << ((byte)(ms->cParams).searchLog & 0x1f));
                    local_108 = -uVar33;
                    bVar50 = true;
                    local_c8 = ms->hashTable;
                    UVar38 = local_c8[local_c0];
                    local_ec = uVar35 + 8;
                    uVar29 = uVar35 + 9;
                    uVar22 = uVar33 + 3;
                    puVar32 = (ulong *)((long)puVar23 + 4);
                    local_b8 = (ulong *)((long)puVar23 + 0xc);
                    local_1e0 = (ulong *)local_d0;
                    pBVar17 = (BYTE *)(ulong)uVar37;
                    do {
                      if (uVar33 == 3) {
                        uVar24 = local_130->rep[0] - 1;
                      }
                      else {
                        uVar24 = local_130->rep[uVar33];
                      }
                      local_128 = pBVar26;
                      if (uVar35 < uVar37) goto LAB_0012cf61;
                      if (uVar24 - 1 < uVar35 - uVar37) {
                        if ((uint)*puVar23 != *(uint *)((long)puVar23 - (ulong)uVar24))
                        goto LAB_0012b317;
                        puVar46 = (ulong *)((long)puVar32 - (ulong)uVar24);
                        puVar42 = puVar32;
                        if (puVar32 < local_160) {
                          uVar44 = *puVar32 ^ *puVar46;
                          uVar40 = 0;
                          if (uVar44 != 0) {
                            for (; (uVar44 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                            }
                          }
                          uVar40 = uVar40 >> 3 & 0x1fffffff;
                          iVar12 = (int)uVar40;
                          puVar42 = local_b8;
                          if (*puVar46 == *puVar32) {
                            do {
                              puVar46 = puVar46 + 1;
                              if (local_160 <= puVar42) goto LAB_0012b31e;
                              uVar44 = *puVar46;
                              uVar21 = *puVar42;
                              uVar6 = 0;
                              if ((uVar21 ^ uVar44) != 0) {
                                for (; ((uVar21 ^ uVar44) >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
                                }
                              }
                              puVar45 = (ulong *)((uVar6 >> 3 & 0x1fffffff) + (long)puVar42);
                              puVar42 = puVar42 + 1;
                              if (uVar44 != uVar21) {
                                uVar40 = (long)puVar45 - (long)puVar32;
                                puVar42 = puVar45;
                              }
                              iVar12 = (int)uVar40;
                            } while (uVar44 == uVar21);
                          }
                        }
                        else {
LAB_0012b31e:
                          if ((puVar42 < local_110) && ((uint)*puVar46 == (uint)*puVar42)) {
                            puVar42 = (ulong *)((long)puVar42 + 4);
                            puVar46 = (ulong *)((long)puVar46 + 4);
                          }
                          if ((puVar42 < local_118) && ((short)*puVar46 == (short)*puVar42)) {
                            puVar42 = (ulong *)((long)puVar42 + 2);
                            puVar46 = (ulong *)((long)puVar46 + 2);
                          }
                          if (puVar42 < iend) {
                            puVar42 = (ulong *)((long)puVar42 +
                                               (ulong)((BYTE)*puVar46 == (BYTE)*puVar42));
                          }
                          iVar12 = (int)puVar42 - (int)puVar32;
                        }
                        pBVar28 = (BYTE *)(ulong)(iVar12 + 4);
                      }
                      else {
                        if (uVar35 < uVar30) goto LAB_0012cf80;
LAB_0012b317:
                        pBVar28 = (BYTE *)0x0;
                      }
                      uVar24 = (uint)pBVar28;
                      bVar7 = true;
                      if (local_1e0 < pBVar28) {
                        local_148[uVar18].off = (int)local_108 + (int)uVar33;
                        uVar39 = uVar18 + 1;
                        local_148[uVar18].len = uVar24;
                        bVar51 = (ulong *)((long)puVar23 + (long)pBVar28) != iend;
                        bVar7 = bVar51 && uVar24 <= uVar47;
                        local_1e0 = (ulong *)pBVar28;
                        uVar18 = uVar39;
                        if (!bVar51 || uVar24 > uVar47) {
                          pBVar17 = (BYTE *)(ulong)uVar39;
                        }
                      }
                      if (!bVar7) break;
                      uVar33 = uVar33 + 1;
                      bVar50 = uVar33 < uVar22;
                    } while (bVar50);
                    uVar24 = (uint)pBVar17;
                    if (!bVar50) {
                      local_c8[local_c0] = uVar35;
                      local_138 = (U32 *)CONCAT44(local_138._4_4_,uVar35 + 2);
                      local_1b8 = (uint *)0x0;
                      pBVar17 = (BYTE *)0x0;
                      do {
                        if (((uint)local_168 == 0) || (UVar38 < uVar30 + (uVar30 == 0))) break;
                        local_168 = (BYTE *)CONCAT44(local_168._4_4_,(uint)local_168 + -1);
                        puVar19 = local_1b8;
                        if (pBVar17 < local_1b8) {
                          puVar19 = (uint *)pBVar17;
                        }
                        if ((uint)pBVar26 <= UVar38) goto LAB_0012cf9f;
                        if ((BYTE *)((long)puVar19 + (ulong)UVar38) < (BYTE *)(ulong)uVar37)
                        goto LAB_0012cfbe;
                        pBVar28 = (BYTE *)((ulong)UVar38 + (long)local_100);
                        if ((uVar37 <= UVar38) &&
                           (iVar12 = bcmp(pBVar28,puVar23,(size_t)puVar19), pBVar26 = local_128,
                           iVar12 != 0)) goto LAB_0012d078;
                        puVar32 = (ulong *)((long)puVar23 + (long)puVar19);
                        puVar46 = (ulong *)(pBVar28 + (long)puVar19);
                        puVar42 = puVar32;
                        if (puVar32 < puVar36) {
                          uVar22 = *puVar32 ^ *puVar46;
                          uVar33 = 0;
                          if (uVar22 != 0) {
                            for (; (uVar22 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                            }
                          }
                          pBVar41 = (BYTE *)(uVar33 >> 3 & 0x1fffffff);
                          if (*puVar46 == *puVar32) {
                            do {
                              puVar42 = puVar42 + 1;
                              puVar46 = puVar46 + 1;
                              if (puVar36 <= puVar42) goto LAB_0012b53e;
                              uVar22 = *puVar42 ^ *puVar46;
                              uVar33 = 0;
                              if (uVar22 != 0) {
                                for (; (uVar22 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                                }
                              }
                              pBVar41 = (BYTE *)((long)puVar42 +
                                                ((uVar33 >> 3 & 0x1fffffff) - (long)puVar32));
                            } while (*puVar46 == *puVar42);
                          }
                        }
                        else {
LAB_0012b53e:
                          if ((puVar42 < local_110) && ((uint)*puVar46 == (uint)*puVar42)) {
                            puVar42 = (ulong *)((long)puVar42 + 4);
                            puVar46 = (ulong *)((long)puVar46 + 4);
                          }
                          if ((puVar42 < local_118) && ((short)*puVar46 == (short)*puVar42)) {
                            puVar42 = (ulong *)((long)puVar42 + 2);
                            puVar46 = (ulong *)((long)puVar46 + 2);
                          }
                          if (puVar42 < iend) {
                            puVar42 = (ulong *)((long)puVar42 +
                                               (ulong)((BYTE)*puVar46 == (BYTE)*puVar42));
                          }
                          pBVar41 = (BYTE *)((long)puVar42 - (long)puVar32);
                        }
                        pBVar41 = pBVar41 + (long)puVar19;
                        if (local_1e0 < pBVar41) {
                          if (uVar29 < UVar38 || uVar29 - UVar38 == 0) goto LAB_0012d097;
                          if ((BYTE *)(ulong)(uVar29 - UVar38) < pBVar41) {
                            uVar29 = UVar38 + (U32)pBVar41;
                          }
                          local_148[uVar18].off = (int)local_138 - UVar38;
                          local_148[uVar18].len = (U32)pBVar41;
                          uVar18 = uVar18 + 1;
                          bVar50 = false;
                          local_1e0 = (ulong *)pBVar41;
                          if ((pBVar41 < (BYTE *)0x1001) &&
                             ((ulong *)((long)puVar23 + (long)pBVar41) != iend)) goto LAB_0012b60d;
                        }
                        else {
LAB_0012b60d:
                          puVar19 = local_f8 + (UVar38 & local_11c) * 2;
                          if (pBVar28[(long)pBVar41] < *(byte *)((long)puVar23 + (long)pBVar41)) {
                            *local_158 = UVar38;
                            pBVar17 = pBVar41;
                            if (local_13c < UVar38) {
                              puVar19 = puVar19 + 1;
                              local_158 = puVar19;
LAB_0012b684:
                              UVar38 = *puVar19;
                              bVar50 = true;
                            }
                            else {
                              bVar50 = false;
                              local_158 = &local_16c;
                            }
                          }
                          else {
                            *local_150 = UVar38;
                            local_1b8 = (uint *)pBVar41;
                            local_150 = puVar19;
                            if (local_13c < UVar38) goto LAB_0012b684;
                            bVar50 = false;
                            local_150 = &local_16c;
                          }
                        }
                      } while (bVar50);
LAB_0012c2ef:
                      *local_150 = 0;
                      *local_158 = 0;
                      if (uVar29 <= local_ec) goto LAB_0012d20b;
                      ms->nextToUpdate = uVar29 - 8;
                      uVar24 = uVar18;
                    }
                  }
                  else if (UVar13 == 5) {
                    uVar33 = (ulong)(UVar38 != 0);
                    uVar47 = (ms->cParams).targetLength;
                    if (0xffe < uVar47) {
                      uVar47 = 0xfff;
                    }
                    local_138 = (U32 *)CONCAT44(local_138._4_4_,uVar47);
                    local_100 = (ulong *)(ms->window).base;
                    uVar35 = iVar12 - (int)local_100;
                    pBVar26 = (BYTE *)(ulong)uVar35;
                    local_c0 = *puVar23 * -0x30e4432345000000 >>
                               (-(char)(ms->cParams).hashLog & 0x3fU);
                    local_f8 = ms->chainTable;
                    local_11c = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
                    local_13c = uVar35 - local_11c;
                    if (uVar35 < local_11c) {
                      local_13c = 0;
                    }
                    uVar37 = (ms->window).dictLimit;
                    uVar24 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
                    UVar38 = (ms->window).lowLimit;
                    UVar13 = uVar35 - uVar24;
                    if (uVar35 - UVar38 <= uVar24) {
                      UVar13 = UVar38;
                    }
                    if (ms->loadedDictEnd != 0) {
                      UVar13 = UVar38;
                    }
                    uVar22 = (ulong)((local_11c & uVar35) * 2);
                    local_158 = local_f8 + uVar22;
                    local_150 = local_f8 + uVar22 + 1;
                    local_168 = (BYTE *)CONCAT44(local_168._4_4_,
                                                 1 << ((byte)(ms->cParams).searchLog & 0x1f));
                    local_108 = -uVar33;
                    bVar50 = true;
                    local_c8 = ms->hashTable;
                    UVar38 = local_c8[local_c0];
                    local_ec = uVar35 + 8;
                    uVar29 = uVar35 + 9;
                    uVar22 = uVar33 + 3;
                    puVar32 = (ulong *)((long)puVar23 + 4);
                    local_b8 = (ulong *)((long)puVar23 + 0xc);
                    local_1e0 = (ulong *)local_d0;
                    pUVar34 = local_f8;
                    uVar24 = 0;
                    do {
                      if (uVar33 == 3) {
                        uVar18 = local_130->rep[0] - 1;
                      }
                      else {
                        uVar18 = local_130->rep[uVar33];
                      }
                      local_128 = pBVar26;
                      if (uVar35 < uVar37) goto LAB_0012cf61;
                      if (uVar18 - 1 < uVar35 - uVar37) {
                        if ((uint)*puVar23 != *(uint *)((long)puVar23 - (ulong)uVar18))
                        goto LAB_0012b935;
                        puVar46 = (ulong *)((long)puVar32 - (ulong)uVar18);
                        puVar42 = puVar32;
                        if (puVar32 < local_160) {
                          uVar44 = *puVar32 ^ *puVar46;
                          uVar40 = 0;
                          if (uVar44 != 0) {
                            for (; (uVar44 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                            }
                          }
                          uVar40 = uVar40 >> 3 & 0x1fffffff;
                          iVar12 = (int)uVar40;
                          puVar42 = local_b8;
                          if (*puVar46 == *puVar32) {
                            do {
                              puVar46 = puVar46 + 1;
                              if (local_160 <= puVar42) goto LAB_0012b93c;
                              uVar44 = *puVar46;
                              uVar21 = *puVar42;
                              uVar6 = 0;
                              if ((uVar21 ^ uVar44) != 0) {
                                for (; ((uVar21 ^ uVar44) >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
                                }
                              }
                              puVar45 = (ulong *)((uVar6 >> 3 & 0x1fffffff) + (long)puVar42);
                              puVar42 = puVar42 + 1;
                              if (uVar44 != uVar21) {
                                uVar40 = (long)puVar45 - (long)puVar32;
                                puVar42 = puVar45;
                              }
                              iVar12 = (int)uVar40;
                            } while (uVar44 == uVar21);
                          }
                        }
                        else {
LAB_0012b93c:
                          if ((puVar42 < local_110) && ((uint)*puVar46 == (uint)*puVar42)) {
                            puVar42 = (ulong *)((long)puVar42 + 4);
                            puVar46 = (ulong *)((long)puVar46 + 4);
                          }
                          if ((puVar42 < local_118) && ((short)*puVar46 == (short)*puVar42)) {
                            puVar42 = (ulong *)((long)puVar42 + 2);
                            puVar46 = (ulong *)((long)puVar46 + 2);
                          }
                          if (puVar42 < iend) {
                            puVar42 = (ulong *)((long)puVar42 +
                                               (ulong)((BYTE)*puVar46 == (BYTE)*puVar42));
                          }
                          iVar12 = (int)puVar42 - (int)puVar32;
                        }
                        pBVar17 = (BYTE *)(ulong)(iVar12 + 4);
                      }
                      else {
                        if (uVar35 < UVar13) goto LAB_0012cf80;
LAB_0012b935:
                        pBVar17 = (BYTE *)0x0;
                      }
                      uVar30 = (uint)pBVar17;
                      bVar7 = true;
                      uVar18 = uVar24;
                      if (local_1e0 < pBVar17) {
                        local_148[uVar24].off = (int)local_108 + (int)uVar33;
                        uVar18 = uVar24 + 1;
                        local_148[uVar24].len = uVar30;
                        bVar51 = (ulong *)((long)puVar23 + (long)pBVar17) != iend;
                        bVar7 = bVar51 && uVar30 <= uVar47;
                        pUVar34 = (U32 *)((ulong)pUVar34 & 0xffffffff);
                        local_1e0 = (ulong *)pBVar17;
                        if (!bVar51 || uVar30 > uVar47) {
                          pUVar34 = (U32 *)(ulong)uVar18;
                        }
                      }
                      if (!bVar7) break;
                      uVar33 = uVar33 + 1;
                      bVar50 = uVar33 < uVar22;
                      uVar24 = uVar18;
                    } while (bVar50);
                    uVar24 = (uint)pUVar34;
                    if (!bVar50) {
                      local_c8[local_c0] = uVar35;
                      local_138 = (U32 *)CONCAT44(local_138._4_4_,uVar35 + 2);
                      local_1b8 = (uint *)0x0;
                      pBVar17 = (BYTE *)0x0;
                      do {
                        if (((uint)local_168 == 0) || (UVar38 < UVar13 + (UVar13 == 0))) break;
                        local_168 = (BYTE *)CONCAT44(local_168._4_4_,(uint)local_168 + -1);
                        puVar19 = local_1b8;
                        if (pBVar17 < local_1b8) {
                          puVar19 = (uint *)pBVar17;
                        }
                        if ((uint)pBVar26 <= UVar38) goto LAB_0012cf9f;
                        if ((BYTE *)((long)puVar19 + (ulong)UVar38) < (BYTE *)(ulong)uVar37)
                        goto LAB_0012cfbe;
                        pBVar28 = (BYTE *)((ulong)UVar38 + (long)local_100);
                        if ((uVar37 <= UVar38) &&
                           (iVar12 = bcmp(pBVar28,puVar23,(size_t)puVar19), pBVar26 = local_128,
                           iVar12 != 0)) goto LAB_0012d078;
                        puVar32 = (ulong *)((long)puVar23 + (long)puVar19);
                        puVar46 = (ulong *)(pBVar28 + (long)puVar19);
                        puVar42 = puVar32;
                        if (puVar32 < puVar36) {
                          uVar22 = *puVar32 ^ *puVar46;
                          uVar33 = 0;
                          if (uVar22 != 0) {
                            for (; (uVar22 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                            }
                          }
                          pBVar41 = (BYTE *)(uVar33 >> 3 & 0x1fffffff);
                          if (*puVar46 == *puVar32) {
                            do {
                              puVar42 = puVar42 + 1;
                              puVar46 = puVar46 + 1;
                              if (puVar36 <= puVar42) goto LAB_0012bb5c;
                              uVar22 = *puVar42 ^ *puVar46;
                              uVar33 = 0;
                              if (uVar22 != 0) {
                                for (; (uVar22 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                                }
                              }
                              pBVar41 = (BYTE *)((long)puVar42 +
                                                ((uVar33 >> 3 & 0x1fffffff) - (long)puVar32));
                            } while (*puVar46 == *puVar42);
                          }
                        }
                        else {
LAB_0012bb5c:
                          if ((puVar42 < local_110) && ((uint)*puVar46 == (uint)*puVar42)) {
                            puVar42 = (ulong *)((long)puVar42 + 4);
                            puVar46 = (ulong *)((long)puVar46 + 4);
                          }
                          if ((puVar42 < local_118) && ((short)*puVar46 == (short)*puVar42)) {
                            puVar42 = (ulong *)((long)puVar42 + 2);
                            puVar46 = (ulong *)((long)puVar46 + 2);
                          }
                          if (puVar42 < iend) {
                            puVar42 = (ulong *)((long)puVar42 +
                                               (ulong)((BYTE)*puVar46 == (BYTE)*puVar42));
                          }
                          pBVar41 = (BYTE *)((long)puVar42 - (long)puVar32);
                        }
                        pBVar41 = pBVar41 + (long)puVar19;
                        if (local_1e0 < pBVar41) {
                          if (uVar29 < UVar38 || uVar29 - UVar38 == 0) goto LAB_0012d097;
                          if ((BYTE *)(ulong)(uVar29 - UVar38) < pBVar41) {
                            uVar29 = UVar38 + (U32)pBVar41;
                          }
                          local_148[uVar18].off = (int)local_138 - UVar38;
                          local_148[uVar18].len = (U32)pBVar41;
                          uVar18 = uVar18 + 1;
                          bVar50 = false;
                          local_1e0 = (ulong *)pBVar41;
                          if ((pBVar41 < (BYTE *)0x1001) &&
                             ((ulong *)((long)puVar23 + (long)pBVar41) != iend)) goto LAB_0012bc2b;
                        }
                        else {
LAB_0012bc2b:
                          puVar19 = local_f8 + (UVar38 & local_11c) * 2;
                          if (pBVar28[(long)pBVar41] < *(byte *)((long)puVar23 + (long)pBVar41)) {
                            *local_158 = UVar38;
                            pBVar17 = pBVar41;
                            if (local_13c < UVar38) {
                              puVar19 = puVar19 + 1;
                              local_158 = puVar19;
LAB_0012bca2:
                              UVar38 = *puVar19;
                              bVar50 = true;
                            }
                            else {
                              bVar50 = false;
                              local_158 = &local_16c;
                            }
                          }
                          else {
                            *local_150 = UVar38;
                            local_1b8 = (uint *)pBVar41;
                            local_150 = puVar19;
                            if (local_13c < UVar38) goto LAB_0012bca2;
                            bVar50 = false;
                            local_150 = &local_16c;
                          }
                        }
                      } while (bVar50);
                      goto LAB_0012c2ef;
                    }
                  }
                  else if (UVar13 == 3) {
                    uVar33 = (ulong)(UVar38 != 0);
                    uVar47 = (ms->cParams).targetLength;
                    if (0xffe < uVar47) {
                      uVar47 = 0xfff;
                    }
                    local_100 = (ulong *)(ms->window).base;
                    uVar18 = iVar12 - (int)local_100;
                    local_c0 = (ulong)((uint)*puVar23 * -0x61c8864f >>
                                      (-(char)(ms->cParams).hashLog & 0x1fU));
                    local_f8 = ms->chainTable;
                    local_11c = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
                    local_13c = uVar18 - local_11c;
                    local_168 = (BYTE *)((ulong)local_168._4_4_ << 0x20);
                    if (uVar18 < local_11c) {
                      local_13c = 0;
                    }
                    uVar35 = (ms->window).dictLimit;
                    uVar30 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
                    uVar24 = (ms->window).lowLimit;
                    uVar37 = uVar18 - uVar30;
                    if (uVar18 - uVar24 <= uVar30) {
                      uVar37 = uVar24;
                    }
                    if (ms->loadedDictEnd != 0) {
                      uVar37 = uVar24;
                    }
                    uVar29 = uVar37 + (uVar37 == 0);
                    uVar22 = (ulong)((local_11c & uVar18) * 2);
                    local_158 = local_f8 + uVar22;
                    local_150 = local_f8 + uVar22 + 1;
                    local_128 = (BYTE *)CONCAT44(local_128._4_4_,
                                                 1 << ((byte)(ms->cParams).searchLog & 0x1f));
                    local_138 = (U32 *)-uVar33;
                    bVar50 = true;
                    local_c8 = ms->hashTable;
                    uVar30 = local_c8[local_c0];
                    local_ec = uVar18 + 8;
                    local_108 = CONCAT44(local_108._4_4_,uVar18 + 9);
                    uVar22 = uVar33 + 3;
                    puVar32 = (ulong *)((long)puVar23 + 3);
                    local_b8 = (ulong *)((long)puVar23 + 0xb);
                    local_1d8 = local_d0;
                    local_1e0 = local_b8;
                    do {
                      if (uVar33 == 3) {
                        UVar38 = local_130->rep[0] - 1;
                      }
                      else {
                        UVar38 = local_130->rep[uVar33];
                      }
                      if (uVar18 < uVar35) goto LAB_0012cf61;
                      if (UVar38 - 1 < uVar18 - uVar35) {
                        if (((*(uint *)((long)puVar23 - (ulong)UVar38) ^ (uint)*puVar23) & 0xffffff)
                            != 0) goto LAB_0012afb0;
                        puVar46 = (ulong *)((long)puVar32 - (ulong)UVar38);
                        puVar42 = puVar32;
                        if (puVar32 < local_160) {
                          uVar44 = *puVar32 ^ *puVar46;
                          uVar40 = 0;
                          if (uVar44 != 0) {
                            for (; (uVar44 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                            }
                          }
                          uVar40 = uVar40 >> 3 & 0x1fffffff;
                          iVar12 = (int)uVar40;
                          puVar42 = local_b8;
                          if (*puVar46 == *puVar32) {
                            do {
                              puVar46 = puVar46 + 1;
                              if (local_160 <= puVar42) goto LAB_0012b042;
                              uVar44 = *puVar46;
                              uVar21 = *puVar42;
                              uVar6 = 0;
                              if ((uVar21 ^ uVar44) != 0) {
                                for (; ((uVar21 ^ uVar44) >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
                                }
                              }
                              puVar45 = (ulong *)((uVar6 >> 3 & 0x1fffffff) + (long)puVar42);
                              puVar42 = puVar42 + 1;
                              if (uVar44 != uVar21) {
                                uVar40 = (long)puVar45 - (long)puVar32;
                                puVar42 = puVar45;
                              }
                              iVar12 = (int)uVar40;
                            } while (uVar44 == uVar21);
                          }
                        }
                        else {
LAB_0012b042:
                          if ((puVar42 < local_110) && ((uint)*puVar46 == (uint)*puVar42)) {
                            puVar42 = (ulong *)((long)puVar42 + 4);
                            puVar46 = (ulong *)((long)puVar46 + 4);
                          }
                          if ((puVar42 < local_118) && ((short)*puVar46 == (short)*puVar42)) {
                            puVar42 = (ulong *)((long)puVar42 + 2);
                            puVar46 = (ulong *)((long)puVar46 + 2);
                          }
                          if (puVar42 < iend) {
                            puVar42 = (ulong *)((long)puVar42 +
                                               (ulong)((BYTE)*puVar46 == (BYTE)*puVar42));
                          }
                          iVar12 = (int)puVar42 - (int)puVar32;
                        }
                        pBVar26 = (BYTE *)(ulong)(iVar12 + 3);
                      }
                      else {
                        if (uVar18 < uVar37) goto LAB_0012cf80;
LAB_0012afb0:
                        pBVar26 = (BYTE *)0x0;
                      }
                      uVar24 = (uint)pBVar26;
                      bVar7 = true;
                      if (local_1d8 < pBVar26) {
                        local_148[(ulong)local_168 & 0xffffffff].off = (int)local_138 + (int)uVar33;
                        uVar39 = (uint)local_168 + 1;
                        local_148[(ulong)local_168 & 0xffffffff].len = uVar24;
                        bVar51 = (ulong *)((long)puVar23 + (long)pBVar26) != iend;
                        bVar7 = bVar51 && uVar24 <= uVar47;
                        local_168 = (BYTE *)CONCAT44(local_168._4_4_,uVar39);
                        local_1e0 = (ulong *)((ulong)local_1e0 & 0xffffffff);
                        local_1d8 = pBVar26;
                        if (!bVar51 || uVar24 > uVar47) {
                          local_1e0 = (ulong *)(ulong)uVar39;
                        }
                      }
                      if (!bVar7) break;
                      uVar33 = uVar33 + 1;
                      bVar50 = uVar33 < uVar22;
                    } while (bVar50);
                    uVar24 = (uint)local_1e0;
                    if (!bVar50) {
                      if (local_1d8 < (BYTE *)0x3) {
                        UVar38 = ZSTD_insertAndFindFirstIndexHash3(ms,&local_7c,(BYTE *)puVar23);
                        bVar50 = true;
                        if ((uVar29 <= UVar38) && (uVar18 - UVar38 < 0x40000)) {
                          puVar42 = (ulong *)((ulong)UVar38 + (long)local_100);
                          puVar32 = puVar23;
                          if (puVar23 < puVar36) {
                            uVar22 = *puVar23 ^ *puVar42;
                            uVar33 = 0;
                            if (uVar22 != 0) {
                              for (; (uVar22 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                              }
                            }
                            pBVar26 = (BYTE *)(uVar33 >> 3 & 0x1fffffff);
                            if (*puVar42 == *puVar23) {
                              do {
                                puVar32 = puVar32 + 1;
                                puVar42 = puVar42 + 1;
                                if (puVar36 <= puVar32) goto LAB_0012c415;
                                uVar22 = *puVar32 ^ *puVar42;
                                uVar33 = 0;
                                if (uVar22 != 0) {
                                  for (; (uVar22 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                                  }
                                }
                                pBVar26 = (BYTE *)((long)puVar32 +
                                                  ((uVar33 >> 3 & 0x1fffffff) - (long)puVar23));
                              } while (*puVar42 == *puVar32);
                            }
                          }
                          else {
LAB_0012c415:
                            if ((puVar32 < local_110) && ((uint)*puVar42 == (uint)*puVar32)) {
                              puVar32 = (ulong *)((long)puVar32 + 4);
                              puVar42 = (ulong *)((long)puVar42 + 4);
                            }
                            if ((puVar32 < local_118) && ((short)*puVar42 == (short)*puVar32)) {
                              puVar32 = (ulong *)((long)puVar32 + 2);
                              puVar42 = (ulong *)((long)puVar42 + 2);
                            }
                            if (puVar32 < iend) {
                              puVar32 = (ulong *)((long)puVar32 +
                                                 (ulong)((BYTE)*puVar42 == (BYTE)*puVar32));
                            }
                            pBVar26 = (BYTE *)((long)puVar32 - (long)puVar23);
                          }
                          if ((BYTE *)0x2 < pBVar26) {
                            if (uVar18 <= UVar38) goto LAB_0012d268;
                            if ((uint)local_168 != 0) goto LAB_0012d287;
                            local_148->off = (uVar18 - UVar38) + 2;
                            local_148->len = (U32)pBVar26;
                            local_1d8 = pBVar26;
                            if (((BYTE *)(ulong)uVar47 < pBVar26) ||
                               ((ulong *)((long)puVar23 + (long)pBVar26) == iend)) {
                              ms->nextToUpdate = uVar18 + 1;
                              local_168 = (BYTE *)CONCAT44(local_168._4_4_,1);
                              bVar50 = false;
                              local_1e0._0_4_ = 1;
                            }
                            else {
                              local_168 = (BYTE *)CONCAT44(local_168._4_4_,1);
                            }
                          }
                        }
                        uVar24 = (uint)local_1e0;
                        if (!bVar50) goto LAB_0012c7df;
                      }
                      local_c8[local_c0] = uVar18;
                      uVar33 = (ulong)local_168 & 0xffffffff;
                      local_168 = (BYTE *)0x0;
                      pBVar26 = (BYTE *)0x0;
                      do {
                        uVar24 = (uint)uVar33;
                        if (((int)local_128 == 0) || (uVar30 < uVar29)) break;
                        pBVar17 = local_168;
                        if (pBVar26 < local_168) {
                          pBVar17 = pBVar26;
                        }
                        if (uVar18 <= uVar30) goto LAB_0012cf9f;
                        local_128 = (BYTE *)CONCAT44(local_128._4_4_,(int)local_128 + -1);
                        if (pBVar17 + uVar30 < (BYTE *)(ulong)uVar35) goto LAB_0012cfbe;
                        pBVar28 = (BYTE *)((ulong)uVar30 + (long)local_100);
                        if ((uVar35 <= uVar30) &&
                           (iVar12 = bcmp(pBVar28,puVar23,(size_t)pBVar17), iVar12 != 0))
                        goto LAB_0012d078;
                        puVar32 = (ulong *)((long)puVar23 + (long)pBVar17);
                        puVar46 = (ulong *)(pBVar28 + (long)pBVar17);
                        puVar42 = puVar32;
                        if (puVar32 < puVar36) {
                          uVar40 = *puVar32 ^ *puVar46;
                          uVar22 = 0;
                          if (uVar40 != 0) {
                            for (; (uVar40 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                            }
                          }
                          pBVar41 = (BYTE *)(uVar22 >> 3 & 0x1fffffff);
                          if (*puVar46 == *puVar32) {
                            do {
                              puVar42 = puVar42 + 1;
                              puVar46 = puVar46 + 1;
                              if (puVar36 <= puVar42) goto LAB_0012c628;
                              uVar40 = *puVar42 ^ *puVar46;
                              uVar22 = 0;
                              if (uVar40 != 0) {
                                for (; (uVar40 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                                }
                              }
                              pBVar41 = (BYTE *)((long)puVar42 +
                                                ((uVar22 >> 3 & 0x1fffffff) - (long)puVar32));
                            } while (*puVar46 == *puVar42);
                          }
                        }
                        else {
LAB_0012c628:
                          if ((puVar42 < local_110) && ((uint)*puVar46 == (uint)*puVar42)) {
                            puVar42 = (ulong *)((long)puVar42 + 4);
                            puVar46 = (ulong *)((long)puVar46 + 4);
                          }
                          if ((puVar42 < local_118) && ((short)*puVar46 == (short)*puVar42)) {
                            puVar42 = (ulong *)((long)puVar42 + 2);
                            puVar46 = (ulong *)((long)puVar46 + 2);
                          }
                          if (puVar42 < iend) {
                            puVar42 = (ulong *)((long)puVar42 +
                                               (ulong)((BYTE)*puVar46 == (BYTE)*puVar42));
                          }
                          pBVar41 = (BYTE *)((long)puVar42 - (long)puVar32);
                        }
                        pBVar41 = pBVar41 + (long)pBVar17;
                        if (local_1d8 < pBVar41) {
                          if ((uint)local_108 < uVar30 || (uint)local_108 - uVar30 == 0)
                          goto LAB_0012d097;
                          uVar47 = (uint)local_108;
                          if ((BYTE *)(ulong)((uint)local_108 - uVar30) < pBVar41) {
                            uVar47 = uVar30 + (U32)pBVar41;
                          }
                          local_108 = CONCAT44(local_108._4_4_,uVar47);
                          local_148[uVar33].off = (uVar18 + 2) - uVar30;
                          local_148[uVar33].len = (U32)pBVar41;
                          uVar33 = (ulong)(uVar24 + 1);
                          bVar50 = false;
                          local_1d8 = pBVar41;
                          if ((pBVar41 < (BYTE *)0x1001) &&
                             ((ulong *)((long)puVar23 + (long)pBVar41) != iend)) goto LAB_0012c6fb;
                        }
                        else {
LAB_0012c6fb:
                          puVar19 = local_f8 + (uVar30 & local_11c) * 2;
                          if (pBVar28[(long)pBVar41] < *(byte *)((long)puVar23 + (long)pBVar41)) {
                            *local_158 = uVar30;
                            pBVar26 = pBVar41;
                            if (local_13c < uVar30) {
                              puVar19 = puVar19 + 1;
                              local_158 = puVar19;
LAB_0012c770:
                              uVar30 = *puVar19;
                              bVar50 = true;
                            }
                            else {
                              bVar50 = false;
                              local_158 = &local_16c;
                            }
                          }
                          else {
                            *local_150 = uVar30;
                            local_168 = pBVar41;
                            local_150 = puVar19;
                            if (local_13c < uVar30) goto LAB_0012c770;
                            bVar50 = false;
                            local_150 = &local_16c;
                          }
                        }
                        uVar24 = (uint)uVar33;
                      } while (bVar50);
                      *local_150 = 0;
                      *local_158 = 0;
                      if ((uint)local_108 <= local_ec) goto LAB_0012d20b;
                      ms->nextToUpdate = (uint)local_108 - 8;
                    }
                  }
                  else {
                    uVar33 = (ulong)(UVar38 != 0);
                    uVar47 = (ms->cParams).targetLength;
                    if (0xffe < uVar47) {
                      uVar47 = 0xfff;
                    }
                    local_138 = (U32 *)CONCAT44(local_138._4_4_,uVar47);
                    local_100 = (ulong *)(ms->window).base;
                    uVar35 = iVar12 - (int)local_100;
                    pBVar26 = (BYTE *)(ulong)uVar35;
                    local_c0 = (ulong)((uint)*puVar23 * -0x61c8864f >>
                                      (-(char)(ms->cParams).hashLog & 0x1fU));
                    local_f8 = ms->chainTable;
                    local_11c = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
                    local_13c = uVar35 - local_11c;
                    if (uVar35 < local_11c) {
                      local_13c = 0;
                    }
                    uVar37 = (ms->window).dictLimit;
                    uVar24 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
                    UVar38 = (ms->window).lowLimit;
                    UVar13 = uVar35 - uVar24;
                    if (uVar35 - UVar38 <= uVar24) {
                      UVar13 = UVar38;
                    }
                    if (ms->loadedDictEnd != 0) {
                      UVar13 = UVar38;
                    }
                    uVar22 = (ulong)((local_11c & uVar35) * 2);
                    local_158 = local_f8 + uVar22;
                    local_150 = local_f8 + uVar22 + 1;
                    local_168 = (BYTE *)CONCAT44(local_168._4_4_,
                                                 1 << ((byte)(ms->cParams).searchLog & 0x1f));
                    local_108 = -uVar33;
                    bVar50 = true;
                    local_c8 = ms->hashTable;
                    UVar38 = local_c8[local_c0];
                    local_ec = uVar35 + 8;
                    uVar29 = uVar35 + 9;
                    uVar22 = uVar33 + 3;
                    puVar32 = (ulong *)((long)puVar23 + 4);
                    local_b8 = (ulong *)((long)puVar23 + 0xc);
                    local_1e0 = (ulong *)local_d0;
                    pUVar34 = local_f8;
                    uVar24 = 0;
                    do {
                      if (uVar33 == 3) {
                        uVar18 = local_130->rep[0] - 1;
                      }
                      else {
                        uVar18 = local_130->rep[uVar33];
                      }
                      local_128 = pBVar26;
                      if (uVar35 < uVar37) goto LAB_0012cf61;
                      if (uVar18 - 1 < uVar35 - uVar37) {
                        if ((uint)*puVar23 != *(uint *)((long)puVar23 - (ulong)uVar18))
                        goto LAB_0012bf46;
                        puVar46 = (ulong *)((long)puVar32 - (ulong)uVar18);
                        puVar42 = puVar32;
                        if (puVar32 < local_160) {
                          uVar44 = *puVar32 ^ *puVar46;
                          uVar40 = 0;
                          if (uVar44 != 0) {
                            for (; (uVar44 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                            }
                          }
                          uVar40 = uVar40 >> 3 & 0x1fffffff;
                          iVar12 = (int)uVar40;
                          puVar42 = local_b8;
                          if (*puVar46 == *puVar32) {
                            do {
                              puVar46 = puVar46 + 1;
                              if (local_160 <= puVar42) goto LAB_0012bf4d;
                              uVar44 = *puVar46;
                              uVar21 = *puVar42;
                              uVar6 = 0;
                              if ((uVar21 ^ uVar44) != 0) {
                                for (; ((uVar21 ^ uVar44) >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
                                }
                              }
                              puVar45 = (ulong *)((uVar6 >> 3 & 0x1fffffff) + (long)puVar42);
                              puVar42 = puVar42 + 1;
                              if (uVar44 != uVar21) {
                                uVar40 = (long)puVar45 - (long)puVar32;
                                puVar42 = puVar45;
                              }
                              iVar12 = (int)uVar40;
                            } while (uVar44 == uVar21);
                          }
                        }
                        else {
LAB_0012bf4d:
                          if ((puVar42 < local_110) && ((uint)*puVar46 == (uint)*puVar42)) {
                            puVar42 = (ulong *)((long)puVar42 + 4);
                            puVar46 = (ulong *)((long)puVar46 + 4);
                          }
                          if ((puVar42 < local_118) && ((short)*puVar46 == (short)*puVar42)) {
                            puVar42 = (ulong *)((long)puVar42 + 2);
                            puVar46 = (ulong *)((long)puVar46 + 2);
                          }
                          if (puVar42 < iend) {
                            puVar42 = (ulong *)((long)puVar42 +
                                               (ulong)((BYTE)*puVar46 == (BYTE)*puVar42));
                          }
                          iVar12 = (int)puVar42 - (int)puVar32;
                        }
                        pBVar17 = (BYTE *)(ulong)(iVar12 + 4);
                      }
                      else {
                        if (uVar35 < UVar13) goto LAB_0012cf80;
LAB_0012bf46:
                        pBVar17 = (BYTE *)0x0;
                      }
                      uVar30 = (uint)pBVar17;
                      bVar7 = true;
                      uVar18 = uVar24;
                      if (local_1e0 < pBVar17) {
                        local_148[uVar24].off = (int)local_108 + (int)uVar33;
                        uVar18 = uVar24 + 1;
                        local_148[uVar24].len = uVar30;
                        bVar51 = (ulong *)((long)puVar23 + (long)pBVar17) != iend;
                        bVar7 = bVar51 && uVar30 <= uVar47;
                        pUVar34 = (U32 *)((ulong)pUVar34 & 0xffffffff);
                        local_1e0 = (ulong *)pBVar17;
                        if (!bVar51 || uVar30 > uVar47) {
                          pUVar34 = (U32 *)(ulong)uVar18;
                        }
                      }
                      if (!bVar7) break;
                      uVar33 = uVar33 + 1;
                      bVar50 = uVar33 < uVar22;
                      uVar24 = uVar18;
                    } while (bVar50);
                    uVar24 = (uint)pUVar34;
                    if (!bVar50) {
                      local_c8[local_c0] = uVar35;
                      local_138 = (U32 *)CONCAT44(local_138._4_4_,uVar35 + 2);
                      local_1b8 = (uint *)0x0;
                      pBVar17 = (BYTE *)0x0;
                      do {
                        if (((uint)local_168 == 0) || (UVar38 < UVar13 + (UVar13 == 0))) break;
                        local_168 = (BYTE *)CONCAT44(local_168._4_4_,(uint)local_168 + -1);
                        puVar19 = local_1b8;
                        if (pBVar17 < local_1b8) {
                          puVar19 = (uint *)pBVar17;
                        }
                        if ((uint)pBVar26 <= UVar38) goto LAB_0012cf9f;
                        if ((BYTE *)((long)puVar19 + (ulong)UVar38) < (BYTE *)(ulong)uVar37)
                        goto LAB_0012cfbe;
                        pBVar28 = (BYTE *)((ulong)UVar38 + (long)local_100);
                        if ((uVar37 <= UVar38) &&
                           (iVar12 = bcmp(pBVar28,puVar23,(size_t)puVar19), pBVar26 = local_128,
                           iVar12 != 0)) goto LAB_0012d078;
                        puVar32 = (ulong *)((long)puVar23 + (long)puVar19);
                        puVar46 = (ulong *)(pBVar28 + (long)puVar19);
                        puVar42 = puVar32;
                        if (puVar32 < puVar36) {
                          uVar22 = *puVar32 ^ *puVar46;
                          uVar33 = 0;
                          if (uVar22 != 0) {
                            for (; (uVar22 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                            }
                          }
                          pBVar41 = (BYTE *)(uVar33 >> 3 & 0x1fffffff);
                          if (*puVar46 == *puVar32) {
                            do {
                              puVar42 = puVar42 + 1;
                              puVar46 = puVar46 + 1;
                              if (puVar36 <= puVar42) goto LAB_0012c16d;
                              uVar22 = *puVar42 ^ *puVar46;
                              uVar33 = 0;
                              if (uVar22 != 0) {
                                for (; (uVar22 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                                }
                              }
                              pBVar41 = (BYTE *)((long)puVar42 +
                                                ((uVar33 >> 3 & 0x1fffffff) - (long)puVar32));
                            } while (*puVar46 == *puVar42);
                          }
                        }
                        else {
LAB_0012c16d:
                          if ((puVar42 < local_110) && ((uint)*puVar46 == (uint)*puVar42)) {
                            puVar42 = (ulong *)((long)puVar42 + 4);
                            puVar46 = (ulong *)((long)puVar46 + 4);
                          }
                          if ((puVar42 < local_118) && ((short)*puVar46 == (short)*puVar42)) {
                            puVar42 = (ulong *)((long)puVar42 + 2);
                            puVar46 = (ulong *)((long)puVar46 + 2);
                          }
                          if (puVar42 < iend) {
                            puVar42 = (ulong *)((long)puVar42 +
                                               (ulong)((BYTE)*puVar46 == (BYTE)*puVar42));
                          }
                          pBVar41 = (BYTE *)((long)puVar42 - (long)puVar32);
                        }
                        pBVar41 = pBVar41 + (long)puVar19;
                        if (local_1e0 < pBVar41) {
                          if (uVar29 < UVar38 || uVar29 - UVar38 == 0) goto LAB_0012d097;
                          if ((BYTE *)(ulong)(uVar29 - UVar38) < pBVar41) {
                            uVar29 = UVar38 + (U32)pBVar41;
                          }
                          local_148[uVar18].off = (int)local_138 - UVar38;
                          local_148[uVar18].len = (U32)pBVar41;
                          uVar18 = uVar18 + 1;
                          bVar50 = false;
                          local_1e0 = (ulong *)pBVar41;
                          if ((pBVar41 < (BYTE *)0x1001) &&
                             ((ulong *)((long)puVar23 + (long)pBVar41) != iend)) goto LAB_0012c23c;
                        }
                        else {
LAB_0012c23c:
                          puVar19 = local_f8 + (UVar38 & local_11c) * 2;
                          if (pBVar28[(long)pBVar41] < *(byte *)((long)puVar23 + (long)pBVar41)) {
                            *local_158 = UVar38;
                            pBVar17 = pBVar41;
                            if (local_13c < UVar38) {
                              puVar19 = puVar19 + 1;
                              local_158 = puVar19;
LAB_0012c2b3:
                              UVar38 = *puVar19;
                              bVar50 = true;
                            }
                            else {
                              bVar50 = false;
                              local_158 = &local_16c;
                            }
                          }
                          else {
                            *local_150 = UVar38;
                            local_1b8 = (uint *)pBVar41;
                            local_150 = puVar19;
                            if (local_13c < UVar38) goto LAB_0012c2b3;
                            bVar50 = false;
                            local_150 = &local_16c;
                          }
                        }
                      } while (bVar50);
                      goto LAB_0012c2ef;
                    }
                  }
                }
LAB_0012c7df:
                pZVar43 = local_98;
                if (uVar24 == 0) {
                  uVar47 = 0x13;
                }
                else {
                  uVar18 = local_148[uVar24 - 1].len;
                  bVar50 = 0xfff < uVar18 + uVar25;
                  if (bVar50 || local_ac < uVar18) {
                    UVar38 = 0;
                    if (local_130->mlen == 0) {
                      UVar38 = local_130->litlen;
                    }
                    uVar25 = uVar25 - UVar38;
                    uVar15 = (ulong)(uVar18 + (uint)local_1a0 + uVar25);
                    if (0x1000 < uVar25) {
                      uVar25 = 0;
                    }
                    pZVar49 = (ZSTD_optimal_t *)(ulong)uVar25;
                    local_d4 = local_148[uVar24 - 1].off;
                    uVar47 = 7;
                    local_90 = (ZSTD_optimal_t *)(ulong)(uint)local_1a0;
                    local_88 = (ZSTD_optimal_t *)(ulong)uVar18;
                  }
                  else {
                    uVar47 = 0;
                  }
                  if (!bVar50 && local_ac >= uVar18) {
                    uVar33 = 0;
                    do {
                      uVar47 = (uint)local_38;
                      if (uVar33 != 0) {
                        uVar47 = local_148[uVar33 - 1].len + 1;
                      }
                      uVar22 = (ulong)local_148[uVar33].len;
                      if (uVar47 <= local_148[uVar33].len) {
                        UVar38 = local_148[uVar33].off;
                        if (UVar38 == 0xffffffff) goto LAB_0012cf04;
                        uVar25 = 0x1f;
                        if (UVar38 + 1 != 0) {
                          for (; UVar38 + 1 >> uVar25 == 0; uVar25 = uVar25 - 1) {
                          }
                        }
                        do {
                          if (uVar22 < 3) goto LAB_0012cf23;
                          UVar13 = (U32)uVar22;
                          if ((ms->opt).priceType == zop_predef) {
                            uVar35 = UVar13 - 2;
                            uVar18 = 0x1f;
                            if (uVar35 != 0) {
                              for (; uVar35 >> uVar18 == 0; uVar18 = uVar18 - 1) {
                              }
                            }
                            if (0x16 < uVar18) goto LAB_0012cee5;
                            iVar12 = (uVar35 * 0x100 >> ((byte)uVar18 & 0x1f)) +
                                     (uVar18 + uVar25) * 0x100 + 0x1000;
                          }
                          else {
                            uVar18 = (ms->opt).offCodeFreq[uVar25] + 1;
                            if (uVar18 == 0) goto LAB_0012cf04;
                            uVar35 = 0x1f;
                            if (uVar18 != 0) {
                              for (; uVar18 >> uVar35 == 0; uVar35 = uVar35 - 1) {
                              }
                            }
                            if (0x16 < uVar35) goto LAB_0012cee5;
                            uVar37 = UVar13 - 3;
                            if (uVar37 < 0x80) {
                              uVar37 = (uint)(byte)(&ZSTD_MLcode(unsigned_int)::ML_Code)[uVar37];
                            }
                            else {
                              uVar30 = 0x1f;
                              if (uVar37 != 0) {
                                for (; uVar37 >> uVar30 == 0; uVar30 = uVar30 - 1) {
                                }
                              }
                              uVar37 = (uVar30 ^ 0xffffffe0) + 0x44;
                            }
                            uVar30 = (ms->opt).matchLengthFreq[uVar37] + 1;
                            if (uVar30 == 0) goto LAB_0012cf04;
                            uVar29 = 0x1f;
                            if (uVar30 != 0) {
                              for (; uVar30 >> uVar29 == 0; uVar29 = uVar29 - 1) {
                              }
                            }
                            if (0x16 < uVar29) goto LAB_0012cee5;
                            iVar12 = (((ms->opt).matchLengthSumBasePrice +
                                      (ms->opt).offCodeSumBasePrice) -
                                     ((uVar18 * 0x100 >> ((byte)uVar35 & 0x1f)) +
                                     (uVar30 * 0x100 >> ((byte)uVar29 & 0x1f)))) +
                                     ((ML_bits[uVar37] + uVar25) - (uVar35 + uVar29)) * 0x100 + 0x33
                            ;
                          }
                          iVar12 = iVar12 + UVar11 + local_6c;
                          uVar18 = (int)pZVar49 + UVar13;
                          uVar40 = (ulong)uVar18;
                          if (((uint)uVar15 < uVar18) || (iVar12 < local_98[uVar40].price)) {
                            if ((uint)uVar15 < uVar18) {
                              uVar15 = uVar15 & 0xffffffff;
                              pZVar48 = local_60 + uVar15;
                              do {
                                uVar15 = uVar15 + 1;
                                pZVar48->price = 0x40000000;
                                pZVar48 = pZVar48 + 1;
                              } while (uVar15 < uVar40);
                            }
                            local_98[uVar40].mlen = UVar13;
                            local_98[uVar40].off = UVar38;
                            local_98[uVar40].litlen = (uint)local_1a0;
                            local_98[uVar40].price = iVar12;
                          }
                          uVar22 = uVar22 - 1;
                        } while (uVar47 <= (uint)uVar22);
                      }
                      uVar33 = uVar33 + 1;
                    } while (uVar33 != uVar24 + (uVar24 == 0));
                    uVar47 = 0;
                  }
                }
              }
            }
            if (uVar47 < 0x11) {
              if (uVar47 != 0) {
                if (uVar47 != 7) goto LAB_0012ceac;
                goto LAB_0012cb2c;
              }
            }
            else if (uVar47 != 0x13) {
              if (uVar47 != 0x11) goto LAB_0012ceac;
              break;
            }
            uVar47 = (int)pZVar49 + 1;
            pZVar48 = (ZSTD_optimal_t *)(ulong)uVar47;
          } while (uVar47 <= (uint)uVar15);
        }
        uVar33 = uVar15 & 0xffffffff;
        local_70 = pZVar43[uVar33].price;
        local_d4 = pZVar43[uVar33].off;
        local_88 = (ZSTD_optimal_t *)(ulong)pZVar43[uVar33].mlen;
        local_90 = (ZSTD_optimal_t *)(ulong)pZVar43[uVar33].litlen;
        local_50 = pZVar43[uVar33].rep[2];
        local_58 = *(undefined8 *)pZVar43[uVar33].rep;
        uVar47 = pZVar43[uVar33].litlen + pZVar43[uVar33].mlen;
        uVar25 = (uint)uVar15 - uVar47;
        if ((uint)uVar15 < uVar47) {
          uVar25 = 0;
        }
        pZVar49 = (ZSTD_optimal_t *)(ulong)uVar25;
        if (0xfff < uVar25) {
          __assert_fail("cur < ZSTD_OPT_NUM",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x4995,
                        "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                       );
        }
        goto LAB_0012cb2c;
      }
LAB_0012ceac:
      local_a8 = pZVar49;
    } while (puVar31 < local_78);
  }
  return (long)iend - (long)local_e0;
}

Assistant:

size_t ZSTD_compressBlock_btultra2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        const void* src, size_t srcSize)
{
    U32 const current = (U32)((const BYTE*)src - ms->window.base);
    DEBUGLOG(5, "ZSTD_compressBlock_btultra2 (srcSize=%zu)", srcSize);

    /* 2-pass strategy:
     * this strategy makes a first pass over first block to collect statistics
     * and seed next round's statistics with it.
     * After 1st pass, function forgets everything, and starts a new block.
     * Consequently, this can only work if no data has been previously loaded in tables,
     * aka, no dictionary, no prefix, no ldm preprocessing.
     * The compression ratio gain is generally small (~0.5% on first block),
     * the cost is 2x cpu time on first block. */
    assert(srcSize <= ZSTD_BLOCKSIZE_MAX);
    if ( (ms->opt.litLengthSum==0)   /* first block */
      && (seqStore->sequences == seqStore->sequencesStart)  /* no ldm */
      && (ms->window.dictLimit == ms->window.lowLimit)   /* no dictionary */
      && (current == ms->window.dictLimit)   /* start of frame, nothing already loaded nor skipped */
      && (srcSize > ZSTD_PREDEF_THRESHOLD)
      ) {
        ZSTD_initStats_ultra(ms, seqStore, rep, src, srcSize);
    }

    return ZSTD_compressBlock_opt_generic(ms, seqStore, rep, src, srcSize, 2 /*optLevel*/, ZSTD_noDict);
}